

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  int iVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  ulong uVar21;
  undefined8 uVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  byte bVar58;
  ulong uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  long lVar64;
  Geometry *pGVar65;
  long lVar66;
  undefined8 unaff_R13;
  ulong uVar67;
  byte bVar68;
  float fVar69;
  float fVar70;
  float fVar122;
  float fVar126;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar123;
  float fVar127;
  float fVar130;
  float fVar131;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar80 [16];
  float fVar124;
  float fVar125;
  float fVar128;
  float fVar129;
  float fVar132;
  float fVar133;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined4 uVar134;
  float fVar144;
  float fVar145;
  vint4 bi_2;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vint4 bi_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  vint4 ai_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  vint4 bi;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  vint4 ai;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [64];
  vint4 ai_1;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_554;
  ulong local_550;
  RayQueryContext *local_548;
  RayHit *local_540;
  ulong local_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  Precalculations *local_508;
  Primitive *local_500;
  long local_4f8;
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Geometry *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar59 = (ulong)(byte)prim[1];
  fVar163 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar76 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar150._0_4_ = fVar163 * auVar76._0_4_;
  auVar150._4_4_ = fVar163 * auVar76._4_4_;
  auVar150._8_4_ = fVar163 * auVar76._8_4_;
  auVar150._12_4_ = fVar163 * auVar76._12_4_;
  auVar80._0_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar80._4_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar80._8_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar80._12_4_ = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xc + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xd + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x12 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x13 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x14 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar200._4_4_ = auVar80._0_4_;
  auVar200._0_4_ = auVar80._0_4_;
  auVar200._8_4_ = auVar80._0_4_;
  auVar200._12_4_ = auVar80._0_4_;
  auVar79 = vshufps_avx(auVar80,auVar80,0x55);
  auVar71 = vshufps_avx(auVar80,auVar80,0xaa);
  fVar163 = auVar71._0_4_;
  auVar173._0_4_ = fVar163 * auVar75._0_4_;
  fVar144 = auVar71._4_4_;
  auVar173._4_4_ = fVar144 * auVar75._4_4_;
  fVar145 = auVar71._8_4_;
  auVar173._8_4_ = fVar145 * auVar75._8_4_;
  fVar69 = auVar71._12_4_;
  auVar173._12_4_ = fVar69 * auVar75._12_4_;
  auVar146._0_4_ = auVar17._0_4_ * fVar163;
  auVar146._4_4_ = auVar17._4_4_ * fVar144;
  auVar146._8_4_ = auVar17._8_4_ * fVar145;
  auVar146._12_4_ = auVar17._12_4_ * fVar69;
  auVar135._0_4_ = auVar78._0_4_ * fVar163;
  auVar135._4_4_ = auVar78._4_4_ * fVar144;
  auVar135._8_4_ = auVar78._8_4_ * fVar145;
  auVar135._12_4_ = auVar78._12_4_ * fVar69;
  auVar71 = vfmadd231ps_fma(auVar173,auVar79,auVar74);
  auVar73 = vfmadd231ps_fma(auVar146,auVar79,auVar77);
  auVar79 = vfmadd231ps_fma(auVar135,auVar19,auVar79);
  auVar72 = vfmadd231ps_fma(auVar71,auVar200,auVar76);
  auVar73 = vfmadd231ps_fma(auVar73,auVar200,auVar16);
  auVar80 = vfmadd231ps_fma(auVar79,auVar18,auVar200);
  auVar201._4_4_ = auVar150._0_4_;
  auVar201._0_4_ = auVar150._0_4_;
  auVar201._8_4_ = auVar150._0_4_;
  auVar201._12_4_ = auVar150._0_4_;
  auVar79 = vshufps_avx(auVar150,auVar150,0x55);
  auVar71 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar163 = auVar71._0_4_;
  auVar202._0_4_ = fVar163 * auVar75._0_4_;
  fVar144 = auVar71._4_4_;
  auVar202._4_4_ = fVar144 * auVar75._4_4_;
  fVar145 = auVar71._8_4_;
  auVar202._8_4_ = fVar145 * auVar75._8_4_;
  fVar69 = auVar71._12_4_;
  auVar202._12_4_ = fVar69 * auVar75._12_4_;
  auVar164._0_4_ = auVar17._0_4_ * fVar163;
  auVar164._4_4_ = auVar17._4_4_ * fVar144;
  auVar164._8_4_ = auVar17._8_4_ * fVar145;
  auVar164._12_4_ = auVar17._12_4_ * fVar69;
  auVar151._0_4_ = auVar78._0_4_ * fVar163;
  auVar151._4_4_ = auVar78._4_4_ * fVar144;
  auVar151._8_4_ = auVar78._8_4_ * fVar145;
  auVar151._12_4_ = auVar78._12_4_ * fVar69;
  auVar74 = vfmadd231ps_fma(auVar202,auVar79,auVar74);
  auVar75 = vfmadd231ps_fma(auVar164,auVar79,auVar77);
  auVar77 = vfmadd231ps_fma(auVar151,auVar79,auVar19);
  auVar17 = vfmadd231ps_fma(auVar74,auVar201,auVar76);
  auVar19 = vfmadd231ps_fma(auVar75,auVar201,auVar16);
  auVar190._8_4_ = 0x7fffffff;
  auVar190._0_8_ = 0x7fffffff7fffffff;
  auVar190._12_4_ = 0x7fffffff;
  auVar78 = vfmadd231ps_fma(auVar77,auVar201,auVar18);
  auVar76 = vandps_avx(auVar72,auVar190);
  auVar185._8_4_ = 0x219392ef;
  auVar185._0_8_ = 0x219392ef219392ef;
  auVar185._12_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar76,auVar185,1);
  bVar10 = (bool)((byte)uVar67 & 1);
  auVar71._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar72._0_4_;
  bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar72._4_4_;
  bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar72._8_4_;
  bVar10 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar72._12_4_;
  auVar76 = vandps_avx(auVar73,auVar190);
  uVar67 = vcmpps_avx512vl(auVar76,auVar185,1);
  bVar10 = (bool)((byte)uVar67 & 1);
  auVar72._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar73._0_4_;
  bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar73._4_4_;
  bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar73._8_4_;
  bVar10 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar73._12_4_;
  auVar76 = vandps_avx(auVar80,auVar190);
  uVar67 = vcmpps_avx512vl(auVar76,auVar185,1);
  bVar10 = (bool)((byte)uVar67 & 1);
  auVar73._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._0_4_;
  bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._4_4_;
  bVar10 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._8_4_;
  bVar10 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar80._12_4_;
  auVar74 = vrcp14ps_avx512vl(auVar71);
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = 0x3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar71,auVar74,auVar186);
  auVar75 = vfmadd132ps_fma(auVar76,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar76 = vfnmadd213ps_fma(auVar72,auVar74,auVar186);
  auVar77 = vfmadd132ps_fma(auVar76,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar74,auVar186);
  auVar18 = vfmadd132ps_fma(auVar76,auVar74,auVar74);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar17);
  auVar179._0_4_ = auVar75._0_4_ * auVar76._0_4_;
  auVar179._4_4_ = auVar75._4_4_ * auVar76._4_4_;
  auVar179._8_4_ = auVar75._8_4_ * auVar76._8_4_;
  auVar179._12_4_ = auVar75._12_4_ * auVar76._12_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar76 = vpmovsxwd_avx(auVar74);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar17);
  auVar174._0_4_ = auVar75._0_4_ * auVar76._0_4_;
  auVar174._4_4_ = auVar75._4_4_ * auVar76._4_4_;
  auVar174._8_4_ = auVar75._8_4_ * auVar76._8_4_;
  auVar174._12_4_ = auVar75._12_4_ * auVar76._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar59 * 0xe + 6);
  auVar76 = vpmovsxwd_avx(auVar75);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar19);
  auVar187._0_4_ = auVar77._0_4_ * auVar76._0_4_;
  auVar187._4_4_ = auVar77._4_4_ * auVar76._4_4_;
  auVar187._8_4_ = auVar77._8_4_ * auVar76._8_4_;
  auVar187._12_4_ = auVar77._12_4_ * auVar76._12_4_;
  auVar75 = vpbroadcastd_avx512vl();
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar76 = vpmovsxwd_avx(auVar16);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar19);
  auVar147._0_4_ = auVar77._0_4_ * auVar76._0_4_;
  auVar147._4_4_ = auVar77._4_4_ * auVar76._4_4_;
  auVar147._8_4_ = auVar77._8_4_ * auVar76._8_4_;
  auVar147._12_4_ = auVar77._12_4_ * auVar76._12_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar59 * 0x15 + 6);
  auVar76 = vpmovsxwd_avx(auVar77);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar78);
  auVar165._0_4_ = auVar18._0_4_ * auVar76._0_4_;
  auVar165._4_4_ = auVar18._4_4_ * auVar76._4_4_;
  auVar165._8_4_ = auVar18._8_4_ * auVar76._8_4_;
  auVar165._12_4_ = auVar18._12_4_ * auVar76._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar76 = vpmovsxwd_avx(auVar17);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar76 = vsubps_avx(auVar76,auVar78);
  auVar136._0_4_ = auVar18._0_4_ * auVar76._0_4_;
  auVar136._4_4_ = auVar18._4_4_ * auVar76._4_4_;
  auVar136._8_4_ = auVar18._8_4_ * auVar76._8_4_;
  auVar136._12_4_ = auVar18._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar179,auVar174);
  auVar74 = vpminsd_avx(auVar187,auVar147);
  auVar76 = vmaxps_avx(auVar76,auVar74);
  auVar74 = vpminsd_avx(auVar165,auVar136);
  uVar134 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar18._4_4_ = uVar134;
  auVar18._0_4_ = uVar134;
  auVar18._8_4_ = uVar134;
  auVar18._12_4_ = uVar134;
  auVar74 = vmaxps_avx512vl(auVar74,auVar18);
  auVar76 = vmaxps_avx(auVar76,auVar74);
  auVar19._8_4_ = 0x3f7ffffa;
  auVar19._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar19._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar76,auVar19);
  auVar76 = vpmaxsd_avx(auVar179,auVar174);
  auVar74 = vpmaxsd_avx(auVar187,auVar147);
  auVar76 = vminps_avx(auVar76,auVar74);
  auVar74 = vpmaxsd_avx(auVar165,auVar136);
  fVar163 = (ray->super_RayK<1>).tfar;
  auVar78._4_4_ = fVar163;
  auVar78._0_4_ = fVar163;
  auVar78._8_4_ = fVar163;
  auVar78._12_4_ = fVar163;
  auVar74 = vminps_avx512vl(auVar74,auVar78);
  auVar76 = vminps_avx(auVar76,auVar74);
  auVar79._8_4_ = 0x3f800003;
  auVar79._0_8_ = 0x3f8000033f800003;
  auVar79._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar79);
  uVar20 = vcmpps_avx512vl(local_190,auVar76,2);
  uVar22 = vpcmpgtd_avx512vl(auVar75,_DAT_01f4ad30);
  uVar67 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar20 & 0xf & (byte)uVar22));
  local_540 = ray;
  local_548 = context;
  local_500 = prim;
  local_508 = pre;
  do {
    auVar94 = local_460;
    if (uVar67 == 0) {
      return;
    }
    lVar64 = 0;
    for (uVar59 = uVar67; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      lVar64 = lVar64 + 1;
    }
    uVar61 = *(uint *)(prim + 2);
    uVar62 = *(uint *)(prim + lVar64 * 4 + 6);
    local_550 = (ulong)uVar61;
    pGVar65 = (context->scene->geometries).items[uVar61].ptr;
    local_538 = (ulong)uVar62;
    uVar59 = (ulong)*(uint *)(*(long *)&pGVar65->field_0x58 +
                             pGVar65[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar62);
    p_Var9 = pGVar65[1].intersectionFilterN;
    lVar64 = *(long *)&pGVar65[1].time_range.upper;
    local_4b0 = *(undefined1 (*) [16])(lVar64 + (long)p_Var9 * uVar59);
    local_4c0 = *(undefined1 (*) [16])(lVar64 + (uVar59 + 1) * (long)p_Var9);
    pauVar3 = (undefined1 (*) [16])(lVar64 + (uVar59 + 2) * (long)p_Var9);
    auVar76 = *pauVar3;
    local_520 = *(undefined8 *)*pauVar3;
    uStack_518 = *(undefined8 *)(*pauVar3 + 8);
    uVar67 = uVar67 - 1 & uVar67;
    pauVar4 = (undefined1 (*) [12])(lVar64 + (uVar59 + 3) * (long)p_Var9);
    local_220 = *(undefined8 *)*pauVar4;
    uStack_218 = *(undefined8 *)(*pauVar4 + 8);
    local_530 = (float)local_220;
    fStack_52c = (float)((ulong)local_220 >> 0x20);
    fStack_528 = (float)uStack_218;
    fStack_524 = (float)((ulong)uStack_218 >> 0x20);
    if (uVar67 != 0) {
      uVar63 = uVar67 - 1 & uVar67;
      for (uVar59 = uVar67; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
      if (uVar63 != 0) {
        for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar8 = (int)pGVar65[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (ray->super_RayK<1>).org.field_0;
    auVar75 = vsubps_avx(local_4b0,(undefined1  [16])aVar5);
    uVar134 = auVar75._0_4_;
    auVar148._4_4_ = uVar134;
    auVar148._0_4_ = uVar134;
    auVar148._8_4_ = uVar134;
    auVar148._12_4_ = uVar134;
    auVar74 = vshufps_avx(auVar75,auVar75,0x55);
    aVar6 = (pre->ray_space).vx.field_0;
    aVar7 = (pre->ray_space).vy.field_0;
    fVar163 = (pre->ray_space).vz.field_0.m128[0];
    fVar144 = (pre->ray_space).vz.field_0.m128[1];
    fVar145 = (pre->ray_space).vz.field_0.m128[2];
    fVar69 = (pre->ray_space).vz.field_0.m128[3];
    auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
    auVar192._0_4_ = auVar75._0_4_ * fVar163;
    auVar192._4_4_ = auVar75._4_4_ * fVar144;
    auVar192._8_4_ = auVar75._8_4_ * fVar145;
    auVar192._12_4_ = auVar75._12_4_ * fVar69;
    auVar74 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar7,auVar74);
    auVar17 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar6,auVar148);
    auVar74 = vshufps_avx(local_4b0,local_4b0,0xff);
    auVar16 = vsubps_avx(local_4c0,(undefined1  [16])aVar5);
    uVar134 = auVar16._0_4_;
    auVar152._4_4_ = uVar134;
    auVar152._0_4_ = uVar134;
    auVar152._8_4_ = uVar134;
    auVar152._12_4_ = uVar134;
    auVar75 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar194._0_4_ = auVar16._0_4_ * fVar163;
    auVar194._4_4_ = auVar16._4_4_ * fVar144;
    auVar194._8_4_ = auVar16._8_4_ * fVar145;
    auVar194._12_4_ = auVar16._12_4_ * fVar69;
    auVar75 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar7,auVar75);
    auVar18 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar6,auVar152);
    auVar75 = vshufps_avx(local_4c0,local_4c0,0xff);
    auVar77 = vsubps_avx512vl(auVar76,(undefined1  [16])aVar5);
    uVar134 = auVar77._0_4_;
    auVar188._4_4_ = uVar134;
    auVar188._0_4_ = uVar134;
    auVar188._8_4_ = uVar134;
    auVar188._12_4_ = uVar134;
    auVar16 = vshufps_avx(auVar77,auVar77,0x55);
    auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar196._0_4_ = auVar77._0_4_ * fVar163;
    auVar196._4_4_ = auVar77._4_4_ * fVar144;
    auVar196._8_4_ = auVar77._8_4_ * fVar145;
    auVar196._12_4_ = auVar77._12_4_ * fVar69;
    auVar16 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar7,auVar16);
    auVar19 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar188);
    auVar78 = vshufps_avx512vl(auVar76,auVar76,0xff);
    auVar54._12_4_ = fStack_524;
    auVar54._0_12_ = *pauVar4;
    local_3e0 = ZEXT1632((undefined1  [16])aVar5);
    auVar77 = vsubps_avx512vl(auVar54,(undefined1  [16])aVar5);
    uVar134 = auVar77._0_4_;
    auVar189._4_4_ = uVar134;
    auVar189._0_4_ = uVar134;
    auVar189._8_4_ = uVar134;
    auVar189._12_4_ = uVar134;
    auVar16 = vshufps_avx(auVar77,auVar77,0x55);
    auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
    auVar199._0_4_ = auVar77._0_4_ * fVar163;
    auVar199._4_4_ = auVar77._4_4_ * fVar144;
    auVar199._8_4_ = auVar77._8_4_ * fVar145;
    auVar199._12_4_ = auVar77._12_4_ * fVar69;
    auVar16 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar7,auVar16);
    auVar16 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar189);
    local_4f8 = (long)iVar8;
    lVar64 = local_4f8 * 0x44;
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar64);
    uVar134 = auVar17._0_4_;
    local_2e0._4_4_ = uVar134;
    local_2e0._0_4_ = uVar134;
    local_2e0._8_4_ = uVar134;
    local_2e0._12_4_ = uVar134;
    local_2e0._16_4_ = uVar134;
    local_2e0._20_4_ = uVar134;
    local_2e0._24_4_ = uVar134;
    local_2e0._28_4_ = uVar134;
    auVar81._8_4_ = 1;
    auVar81._0_8_ = 0x100000001;
    auVar81._12_4_ = 1;
    auVar81._16_4_ = 1;
    auVar81._20_4_ = 1;
    auVar81._24_4_ = 1;
    auVar81._28_4_ = 1;
    local_300 = vpermps_avx512vl(auVar81,ZEXT1632(auVar17));
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 + 0x484);
    local_320 = vbroadcastss_avx512vl(auVar18);
    local_340 = vpermps_avx512vl(auVar81,ZEXT1632(auVar18));
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 + 0x908);
    local_360 = vbroadcastss_avx512vl(auVar19);
    local_380 = vpermps_avx512vl(auVar81,ZEXT1632(auVar19));
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 + 0xd8c);
    uVar134 = auVar16._0_4_;
    local_3a0._4_4_ = uVar134;
    local_3a0._0_4_ = uVar134;
    fStack_398 = (float)uVar134;
    fStack_394 = (float)uVar134;
    fStack_390 = (float)uVar134;
    fStack_38c = (float)uVar134;
    fStack_388 = (float)uVar134;
    register0x0000139c = uVar134;
    _local_3c0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar16));
    auVar81 = vmulps_avx512vl(_local_3a0,auVar97);
    auVar82 = vmulps_avx512vl(_local_3c0,auVar97);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar98,local_360);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar98,local_380);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar100,local_320);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar100,local_340);
    auVar83 = vfmadd231ps_avx512vl(auVar81,auVar96,local_2e0);
    auVar184 = ZEXT3264(auVar83);
    auVar84 = vfmadd231ps_avx512vl(auVar82,auVar96,local_300);
    auVar178 = ZEXT3264(auVar84);
    auVar81 = *(undefined1 (*) [32])(bezier_basis1 + lVar64);
    auVar82 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 + 0x484);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 + 0x908);
    auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 + 0xd8c);
    auVar85 = vmulps_avx512vl(_local_3a0,auVar95);
    auVar86 = vmulps_avx512vl(_local_3c0,auVar95);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar99,local_360);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar99,local_380);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar82,local_320);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_340);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,local_2e0);
    auVar191 = ZEXT3264(auVar85);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,local_300);
    auVar87 = vsubps_avx512vl(auVar85,auVar83);
    auVar88 = vsubps_avx512vl(auVar86,auVar84);
    auVar89 = vmulps_avx512vl(auVar84,auVar87);
    auVar90 = vmulps_avx512vl(auVar83,auVar88);
    auVar89 = vsubps_avx512vl(auVar89,auVar90);
    auVar77 = vshufps_avx512vl(auVar54,auVar54,0xff);
    local_80 = vbroadcastsd_avx512vl(auVar74);
    local_a0 = vbroadcastsd_avx512vl(auVar75);
    local_c0 = vbroadcastsd_avx512vl(auVar78);
    local_e0 = vbroadcastsd_avx512vl(auVar77);
    auVar90 = vmulps_avx512vl(local_e0,auVar97);
    auVar74 = vfmadd231ps_fma(auVar90,auVar98,local_c0);
    auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar100,local_a0);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_80);
    auVar91 = vmulps_avx512vl(local_e0,auVar95);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,local_c0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar82,local_a0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar81,local_80);
    auVar92 = vmulps_avx512vl(auVar88,auVar88);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,auVar87);
    auVar93 = vmaxps_avx512vl(auVar90,auVar91);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    auVar92 = vmulps_avx512vl(auVar93,auVar92);
    auVar89 = vmulps_avx512vl(auVar89,auVar89);
    uVar20 = vcmpps_avx512vl(auVar89,auVar92,2);
    auVar74 = vblendps_avx(auVar17,local_4b0,8);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar77 = vandps_avx512vl(auVar74,auVar75);
    auVar74 = vblendps_avx(auVar18,local_4c0,8);
    auVar74 = vandps_avx512vl(auVar74,auVar75);
    auVar74 = vmaxps_avx(auVar77,auVar74);
    auVar76 = vblendps_avx(auVar19,auVar76,8);
    auVar77 = vandps_avx512vl(auVar76,auVar75);
    auVar76 = vblendps_avx(auVar16,auVar54,8);
    auVar76 = vandps_avx512vl(auVar76,auVar75);
    auVar76 = vmaxps_avx(auVar77,auVar76);
    auVar76 = vmaxps_avx(auVar74,auVar76);
    auVar74 = vmovshdup_avx(auVar76);
    auVar74 = vmaxss_avx(auVar74,auVar76);
    auVar76 = vshufpd_avx(auVar76,auVar76,1);
    auVar76 = vmaxss_avx(auVar76,auVar74);
    auVar89._0_4_ = (float)iVar8;
    local_460._4_12_ = auVar17._4_12_;
    local_460._0_4_ = auVar89._0_4_;
    local_460._16_16_ = auVar94._16_16_;
    auVar89._4_4_ = auVar89._0_4_;
    auVar89._8_4_ = auVar89._0_4_;
    auVar89._12_4_ = auVar89._0_4_;
    auVar89._16_4_ = auVar89._0_4_;
    auVar89._20_4_ = auVar89._0_4_;
    auVar89._24_4_ = auVar89._0_4_;
    auVar89._28_4_ = auVar89._0_4_;
    uVar22 = vcmpps_avx512vl(auVar89,_DAT_01f7b060,0xe);
    bVar68 = (byte)uVar20 & (byte)uVar22;
    fVar163 = auVar76._0_4_ * 4.7683716e-07;
    local_440._0_16_ = ZEXT416((uint)fVar163);
    auVar94._8_4_ = 2;
    auVar94._0_8_ = 0x200000002;
    auVar94._12_4_ = 2;
    auVar94._16_4_ = 2;
    auVar94._20_4_ = 2;
    auVar94._24_4_ = 2;
    auVar94._28_4_ = 2;
    local_120 = vpermps_avx2(auVar94,ZEXT1632(auVar17));
    local_140 = vpermps_avx2(auVar94,ZEXT1632(auVar18));
    local_160 = vpermps_avx2(auVar94,ZEXT1632(auVar19));
    local_180 = vpermps_avx2(auVar94,ZEXT1632(auVar16));
    if (bVar68 != 0) {
      auVar94 = vmulps_avx512vl(local_180,auVar95);
      auVar94 = vfmadd213ps_avx512vl(auVar99,local_160,auVar94);
      auVar94 = vfmadd213ps_avx512vl(auVar82,local_140,auVar94);
      auVar81 = vfmadd213ps_avx512vl(auVar81,local_120,auVar94);
      auVar94 = vmulps_avx512vl(local_180,auVar97);
      auVar94 = vfmadd213ps_avx512vl(auVar98,local_160,auVar94);
      auVar82 = vfmadd213ps_avx512vl(auVar100,local_140,auVar94);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 + 0x1694);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 + 0x1b18);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar64 + 0x1f9c);
      auVar95 = vfmadd213ps_avx512vl(auVar96,local_120,auVar82);
      auVar96 = vmulps_avx512vl(_local_3a0,auVar97);
      auVar82 = vmulps_avx512vl(_local_3c0,auVar97);
      auVar97 = vmulps_avx512vl(local_180,auVar97);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,local_360);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar98,local_380);
      auVar98 = vfmadd231ps_avx512vl(auVar97,local_160,auVar98);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_320);
      auVar97 = vfmadd231ps_avx512vl(auVar82,auVar100,local_340);
      auVar82 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
      auVar76 = vfmadd231ps_fma(auVar96,auVar94,local_2e0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_300);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 + 0x1f9c);
      auVar82 = vfmadd231ps_avx512vl(auVar82,local_120,auVar94);
      auVar94 = vmulps_avx512vl(_local_3a0,auVar98);
      auVar99 = vmulps_avx512vl(_local_3c0,auVar98);
      auVar98 = vmulps_avx512vl(local_180,auVar98);
      auVar92 = vfmadd231ps_avx512vl(auVar94,auVar100,local_360);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar100,local_380);
      auVar100 = vfmadd231ps_avx512vl(auVar98,local_160,auVar100);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar64 + 0x1694);
      auVar98 = vfmadd231ps_avx512vl(auVar92,auVar94,local_320);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,local_340);
      auVar94 = vfmadd231ps_avx512vl(auVar100,local_140,auVar94);
      auVar74 = vfmadd231ps_fma(auVar98,auVar96,local_2e0);
      auVar100 = vfmadd231ps_avx512vl(auVar99,auVar96,local_300);
      auVar98 = vfmadd231ps_avx512vl(auVar94,local_120,auVar96);
      auVar203._8_4_ = 0x7fffffff;
      auVar203._0_8_ = 0x7fffffff7fffffff;
      auVar203._12_4_ = 0x7fffffff;
      auVar203._16_4_ = 0x7fffffff;
      auVar203._20_4_ = 0x7fffffff;
      auVar203._24_4_ = 0x7fffffff;
      auVar203._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(ZEXT1632(auVar76),auVar203);
      auVar96 = vandps_avx(auVar97,auVar203);
      auVar96 = vmaxps_avx(auVar94,auVar96);
      auVar94 = vandps_avx(auVar82,auVar203);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      auVar197._4_4_ = fVar163;
      auVar197._0_4_ = fVar163;
      auVar197._8_4_ = fVar163;
      auVar197._12_4_ = fVar163;
      auVar197._16_4_ = fVar163;
      auVar197._20_4_ = fVar163;
      auVar197._24_4_ = fVar163;
      auVar197._28_4_ = fVar163;
      uVar59 = vcmpps_avx512vl(auVar94,auVar197,1);
      bVar10 = (bool)((byte)uVar59 & 1);
      auVar92._0_4_ = (float)((uint)bVar10 * auVar87._0_4_ | (uint)!bVar10 * auVar76._0_4_);
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar92._4_4_ = (float)((uint)bVar10 * auVar87._4_4_ | (uint)!bVar10 * auVar76._4_4_);
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar92._8_4_ = (float)((uint)bVar10 * auVar87._8_4_ | (uint)!bVar10 * auVar76._8_4_);
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar92._12_4_ = (float)((uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar76._12_4_);
      fVar144 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar87._16_4_);
      auVar92._16_4_ = fVar144;
      fVar163 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar87._20_4_);
      auVar92._20_4_ = fVar163;
      fVar145 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar87._24_4_);
      auVar92._24_4_ = fVar145;
      uVar60 = (uint)(byte)(uVar59 >> 7) * auVar87._28_4_;
      auVar92._28_4_ = uVar60;
      bVar10 = (bool)((byte)uVar59 & 1);
      auVar93._0_4_ = (float)((uint)bVar10 * auVar88._0_4_ | (uint)!bVar10 * auVar97._0_4_);
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar93._4_4_ = (float)((uint)bVar10 * auVar88._4_4_ | (uint)!bVar10 * auVar97._4_4_);
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar93._8_4_ = (float)((uint)bVar10 * auVar88._8_4_ | (uint)!bVar10 * auVar97._8_4_);
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar93._12_4_ = (float)((uint)bVar10 * auVar88._12_4_ | (uint)!bVar10 * auVar97._12_4_);
      bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar93._16_4_ = (float)((uint)bVar10 * auVar88._16_4_ | (uint)!bVar10 * auVar97._16_4_);
      bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar93._20_4_ = (float)((uint)bVar10 * auVar88._20_4_ | (uint)!bVar10 * auVar97._20_4_);
      bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar93._24_4_ = (float)((uint)bVar10 * auVar88._24_4_ | (uint)!bVar10 * auVar97._24_4_);
      bVar10 = SUB81(uVar59 >> 7,0);
      auVar93._28_4_ = (uint)bVar10 * auVar88._28_4_ | (uint)!bVar10 * auVar97._28_4_;
      auVar94 = vandps_avx(auVar203,ZEXT1632(auVar74));
      auVar96 = vandps_avx(auVar100,auVar203);
      auVar96 = vmaxps_avx(auVar94,auVar96);
      auVar94 = vandps_avx(auVar98,auVar203);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      uVar59 = vcmpps_avx512vl(auVar94,auVar197,1);
      bVar10 = (bool)((byte)uVar59 & 1);
      auVar101._0_4_ = (float)((uint)bVar10 * auVar87._0_4_ | (uint)!bVar10 * auVar74._0_4_);
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar10 * auVar87._4_4_ | (uint)!bVar10 * auVar74._4_4_);
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar10 * auVar87._8_4_ | (uint)!bVar10 * auVar74._8_4_);
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar74._12_4_);
      fVar122 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar87._16_4_);
      auVar101._16_4_ = fVar122;
      fVar70 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar87._20_4_);
      auVar101._20_4_ = fVar70;
      fVar69 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar87._24_4_);
      auVar101._24_4_ = fVar69;
      auVar101._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar87._28_4_;
      bVar10 = (bool)((byte)uVar59 & 1);
      auVar87._0_4_ = (float)((uint)bVar10 * auVar88._0_4_ | (uint)!bVar10 * auVar100._0_4_);
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar87._4_4_ = (float)((uint)bVar10 * auVar88._4_4_ | (uint)!bVar10 * auVar100._4_4_);
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar87._8_4_ = (float)((uint)bVar10 * auVar88._8_4_ | (uint)!bVar10 * auVar100._8_4_);
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar87._12_4_ = (float)((uint)bVar10 * auVar88._12_4_ | (uint)!bVar10 * auVar100._12_4_);
      bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar87._16_4_ = (float)((uint)bVar10 * auVar88._16_4_ | (uint)!bVar10 * auVar100._16_4_);
      bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar87._20_4_ = (float)((uint)bVar10 * auVar88._20_4_ | (uint)!bVar10 * auVar100._20_4_);
      bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar87._24_4_ = (float)((uint)bVar10 * auVar88._24_4_ | (uint)!bVar10 * auVar100._24_4_);
      bVar10 = SUB81(uVar59 >> 7,0);
      auVar87._28_4_ = (uint)bVar10 * auVar88._28_4_ | (uint)!bVar10 * auVar100._28_4_;
      auVar79 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
      auVar94 = vfmadd213ps_avx512vl(auVar92,auVar92,ZEXT1632(auVar79));
      auVar76 = vfmadd231ps_fma(auVar94,auVar93,auVar93);
      auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
      fVar123 = auVar94._0_4_;
      fVar126 = auVar94._4_4_;
      fVar127 = auVar94._8_4_;
      fVar130 = auVar94._12_4_;
      fVar131 = auVar94._16_4_;
      fVar124 = auVar94._20_4_;
      fVar125 = auVar94._24_4_;
      auVar96._4_4_ = fVar126 * fVar126 * fVar126 * auVar76._4_4_ * -0.5;
      auVar96._0_4_ = fVar123 * fVar123 * fVar123 * auVar76._0_4_ * -0.5;
      auVar96._8_4_ = fVar127 * fVar127 * fVar127 * auVar76._8_4_ * -0.5;
      auVar96._12_4_ = fVar130 * fVar130 * fVar130 * auVar76._12_4_ * -0.5;
      auVar96._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar96._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
      auVar96._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
      auVar96._28_4_ = 0;
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar82,auVar94);
      auVar100._4_4_ = auVar93._4_4_ * auVar96._4_4_;
      auVar100._0_4_ = auVar93._0_4_ * auVar96._0_4_;
      auVar100._8_4_ = auVar93._8_4_ * auVar96._8_4_;
      auVar100._12_4_ = auVar93._12_4_ * auVar96._12_4_;
      auVar100._16_4_ = auVar93._16_4_ * auVar96._16_4_;
      auVar100._20_4_ = auVar93._20_4_ * auVar96._20_4_;
      auVar100._24_4_ = auVar93._24_4_ * auVar96._24_4_;
      auVar100._28_4_ = auVar94._28_4_;
      auVar98._4_4_ = auVar96._4_4_ * -auVar92._4_4_;
      auVar98._0_4_ = auVar96._0_4_ * -auVar92._0_4_;
      auVar98._8_4_ = auVar96._8_4_ * -auVar92._8_4_;
      auVar98._12_4_ = auVar96._12_4_ * -auVar92._12_4_;
      auVar98._16_4_ = auVar96._16_4_ * -fVar144;
      auVar98._20_4_ = auVar96._20_4_ * -fVar163;
      auVar98._24_4_ = auVar96._24_4_ * -fVar145;
      auVar98._28_4_ = uVar60 ^ 0x80000000;
      auVar94 = vmulps_avx512vl(auVar96,ZEXT1632(auVar79));
      auVar88 = ZEXT1632(auVar79);
      auVar97 = vfmadd213ps_avx512vl(auVar101,auVar101,auVar88);
      auVar76 = vfmadd231ps_fma(auVar97,auVar87,auVar87);
      auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
      fVar163 = auVar99._0_4_;
      fVar144 = auVar99._4_4_;
      fVar145 = auVar99._8_4_;
      fVar123 = auVar99._12_4_;
      fVar126 = auVar99._16_4_;
      fVar127 = auVar99._20_4_;
      fVar130 = auVar99._24_4_;
      auVar97._4_4_ = fVar144 * fVar144 * fVar144 * auVar76._4_4_ * -0.5;
      auVar97._0_4_ = fVar163 * fVar163 * fVar163 * auVar76._0_4_ * -0.5;
      auVar97._8_4_ = fVar145 * fVar145 * fVar145 * auVar76._8_4_ * -0.5;
      auVar97._12_4_ = fVar123 * fVar123 * fVar123 * auVar76._12_4_ * -0.5;
      auVar97._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar97._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar97._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar97._28_4_ = 0;
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar82,auVar99);
      auVar82._4_4_ = auVar87._4_4_ * auVar97._4_4_;
      auVar82._0_4_ = auVar87._0_4_ * auVar97._0_4_;
      auVar82._8_4_ = auVar87._8_4_ * auVar97._8_4_;
      auVar82._12_4_ = auVar87._12_4_ * auVar97._12_4_;
      auVar82._16_4_ = auVar87._16_4_ * auVar97._16_4_;
      auVar82._20_4_ = auVar87._20_4_ * auVar97._20_4_;
      auVar82._24_4_ = auVar87._24_4_ * auVar97._24_4_;
      auVar82._28_4_ = auVar99._28_4_;
      auVar99._4_4_ = -auVar101._4_4_ * auVar97._4_4_;
      auVar99._0_4_ = -auVar101._0_4_ * auVar97._0_4_;
      auVar99._8_4_ = -auVar101._8_4_ * auVar97._8_4_;
      auVar99._12_4_ = -auVar101._12_4_ * auVar97._12_4_;
      auVar99._16_4_ = -fVar122 * auVar97._16_4_;
      auVar99._20_4_ = -fVar70 * auVar97._20_4_;
      auVar99._24_4_ = -fVar69 * auVar97._24_4_;
      auVar99._28_4_ = auVar96._28_4_;
      auVar96 = vmulps_avx512vl(auVar97,auVar88);
      auVar76 = vfmadd213ps_fma(auVar100,auVar90,auVar83);
      auVar74 = vfmadd213ps_fma(auVar98,auVar90,auVar84);
      auVar97 = vfmadd213ps_avx512vl(auVar94,auVar90,auVar95);
      auVar87 = vfmadd213ps_avx512vl(auVar82,auVar91,auVar85);
      auVar17 = vfnmadd213ps_fma(auVar100,auVar90,auVar83);
      auVar75 = vfmadd213ps_fma(auVar99,auVar91,auVar86);
      auVar18 = vfnmadd213ps_fma(auVar98,auVar90,auVar84);
      auVar100 = vfmadd213ps_avx512vl(auVar96,auVar91,auVar81);
      auVar98 = vfnmadd231ps_avx512vl(auVar95,auVar90,auVar94);
      auVar19 = vfnmadd213ps_fma(auVar82,auVar91,auVar85);
      auVar78 = vfnmadd213ps_fma(auVar99,auVar91,auVar86);
      auVar96 = vfnmadd231ps_avx512vl(auVar81,auVar91,auVar96);
      auVar81 = vsubps_avx512vl(auVar87,ZEXT1632(auVar17));
      auVar94 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar18));
      auVar82 = vsubps_avx512vl(auVar100,auVar98);
      auVar99 = vmulps_avx512vl(auVar94,auVar98);
      auVar16 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar18),auVar82);
      auVar95._4_4_ = auVar17._4_4_ * auVar82._4_4_;
      auVar95._0_4_ = auVar17._0_4_ * auVar82._0_4_;
      auVar95._8_4_ = auVar17._8_4_ * auVar82._8_4_;
      auVar95._12_4_ = auVar17._12_4_ * auVar82._12_4_;
      auVar95._16_4_ = auVar82._16_4_ * 0.0;
      auVar95._20_4_ = auVar82._20_4_ * 0.0;
      auVar95._24_4_ = auVar82._24_4_ * 0.0;
      auVar95._28_4_ = auVar82._28_4_;
      auVar82 = vfmsub231ps_avx512vl(auVar95,auVar98,auVar81);
      auVar83._4_4_ = auVar18._4_4_ * auVar81._4_4_;
      auVar83._0_4_ = auVar18._0_4_ * auVar81._0_4_;
      auVar83._8_4_ = auVar18._8_4_ * auVar81._8_4_;
      auVar83._12_4_ = auVar18._12_4_ * auVar81._12_4_;
      auVar83._16_4_ = auVar81._16_4_ * 0.0;
      auVar83._20_4_ = auVar81._20_4_ * 0.0;
      auVar83._24_4_ = auVar81._24_4_ * 0.0;
      auVar83._28_4_ = auVar81._28_4_;
      auVar77 = vfmsub231ps_fma(auVar83,ZEXT1632(auVar17),auVar94);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar88,auVar82);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar88,ZEXT1632(auVar16));
      auVar92 = ZEXT1632(auVar79);
      uVar59 = vcmpps_avx512vl(auVar94,auVar92,2);
      bVar58 = (byte)uVar59;
      fVar69 = (float)((uint)(bVar58 & 1) * auVar76._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar19._0_4_);
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      fVar122 = (float)((uint)bVar10 * auVar76._4_4_ | (uint)!bVar10 * auVar19._4_4_);
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      fVar126 = (float)((uint)bVar10 * auVar76._8_4_ | (uint)!bVar10 * auVar19._8_4_);
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      fVar130 = (float)((uint)bVar10 * auVar76._12_4_ | (uint)!bVar10 * auVar19._12_4_);
      auVar81 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar126,CONCAT44(fVar122,fVar69))));
      fVar70 = (float)((uint)(bVar58 & 1) * auVar74._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar78._0_4_);
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      fVar123 = (float)((uint)bVar10 * auVar74._4_4_ | (uint)!bVar10 * auVar78._4_4_);
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      fVar127 = (float)((uint)bVar10 * auVar74._8_4_ | (uint)!bVar10 * auVar78._8_4_);
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      fVar131 = (float)((uint)bVar10 * auVar74._12_4_ | (uint)!bVar10 * auVar78._12_4_);
      auVar82 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar127,CONCAT44(fVar123,fVar70))));
      auVar88._0_4_ = (uint)(bVar58 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar96._0_4_
      ;
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar88._4_4_ = (uint)bVar10 * auVar97._4_4_ | (uint)!bVar10 * auVar96._4_4_;
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar88._8_4_ = (uint)bVar10 * auVar97._8_4_ | (uint)!bVar10 * auVar96._8_4_;
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar88._12_4_ = (uint)bVar10 * auVar97._12_4_ | (uint)!bVar10 * auVar96._12_4_;
      bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar88._16_4_ = (uint)bVar10 * auVar97._16_4_ | (uint)!bVar10 * auVar96._16_4_;
      bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar88._20_4_ = (uint)bVar10 * auVar97._20_4_ | (uint)!bVar10 * auVar96._20_4_;
      bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar88._24_4_ = (uint)bVar10 * auVar97._24_4_ | (uint)!bVar10 * auVar96._24_4_;
      bVar10 = SUB81(uVar59 >> 7,0);
      auVar88._28_4_ = (uint)bVar10 * auVar97._28_4_ | (uint)!bVar10 * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar17),auVar87);
      auVar102._0_4_ =
           (uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar74._0_4_;
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar102._4_4_ = (uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * auVar74._4_4_;
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar102._8_4_ = (uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * auVar74._8_4_;
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar102._12_4_ = (uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * auVar74._12_4_;
      auVar102._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * auVar96._16_4_;
      auVar102._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * auVar96._20_4_;
      auVar102._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * auVar96._24_4_;
      auVar102._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar18),ZEXT1632(auVar75));
      auVar103._0_4_ =
           (float)((uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar16._0_4_);
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * auVar16._4_4_);
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * auVar16._8_4_);
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * auVar16._12_4_);
      fVar145 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar96._16_4_);
      auVar103._16_4_ = fVar145;
      fVar144 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar96._20_4_);
      auVar103._20_4_ = fVar144;
      fVar163 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar96._24_4_);
      auVar103._24_4_ = fVar163;
      auVar103._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(auVar98,auVar100);
      auVar104._0_4_ =
           (float)((uint)(bVar58 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar97._0_4_);
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar10 * auVar96._4_4_ | (uint)!bVar10 * auVar97._4_4_);
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar10 * auVar96._8_4_ | (uint)!bVar10 * auVar97._8_4_);
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar10 * auVar96._12_4_ | (uint)!bVar10 * auVar97._12_4_);
      bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar10 * auVar96._16_4_ | (uint)!bVar10 * auVar97._16_4_);
      bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar10 * auVar96._20_4_ | (uint)!bVar10 * auVar97._20_4_);
      bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar10 * auVar96._24_4_ | (uint)!bVar10 * auVar97._24_4_);
      bVar10 = SUB81(uVar59 >> 7,0);
      auVar104._28_4_ = (uint)bVar10 * auVar96._28_4_ | (uint)!bVar10 * auVar97._28_4_;
      auVar105._0_4_ =
           (uint)(bVar58 & 1) * (int)auVar17._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar87._0_4_;
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar10 * (int)auVar17._4_4_ | (uint)!bVar10 * auVar87._4_4_;
      bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar10 * (int)auVar17._8_4_ | (uint)!bVar10 * auVar87._8_4_;
      bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar10 * (int)auVar17._12_4_ | (uint)!bVar10 * auVar87._12_4_;
      auVar105._16_4_ = (uint)!(bool)((byte)(uVar59 >> 4) & 1) * auVar87._16_4_;
      auVar105._20_4_ = (uint)!(bool)((byte)(uVar59 >> 5) & 1) * auVar87._20_4_;
      auVar105._24_4_ = (uint)!(bool)((byte)(uVar59 >> 6) & 1) * auVar87._24_4_;
      auVar105._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar87._28_4_;
      bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
      bVar13 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar106._0_4_ =
           (uint)(bVar58 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar100._0_4_;
      bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar11 * auVar98._4_4_ | (uint)!bVar11 * auVar100._4_4_;
      bVar11 = (bool)((byte)(uVar59 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar11 * auVar98._8_4_ | (uint)!bVar11 * auVar100._8_4_;
      bVar11 = (bool)((byte)(uVar59 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar11 * auVar98._12_4_ | (uint)!bVar11 * auVar100._12_4_;
      bVar11 = (bool)((byte)(uVar59 >> 4) & 1);
      auVar106._16_4_ = (uint)bVar11 * auVar98._16_4_ | (uint)!bVar11 * auVar100._16_4_;
      bVar11 = (bool)((byte)(uVar59 >> 5) & 1);
      auVar106._20_4_ = (uint)bVar11 * auVar98._20_4_ | (uint)!bVar11 * auVar100._20_4_;
      bVar11 = (bool)((byte)(uVar59 >> 6) & 1);
      auVar106._24_4_ = (uint)bVar11 * auVar98._24_4_ | (uint)!bVar11 * auVar100._24_4_;
      bVar11 = SUB81(uVar59 >> 7,0);
      auVar106._28_4_ = (uint)bVar11 * auVar98._28_4_ | (uint)!bVar11 * auVar100._28_4_;
      auVar97 = vsubps_avx512vl(auVar105,auVar81);
      auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar18._12_4_ |
                                              (uint)!bVar13 * auVar75._12_4_,
                                              CONCAT48((uint)bVar12 * (int)auVar18._8_4_ |
                                                       (uint)!bVar12 * auVar75._8_4_,
                                                       CONCAT44((uint)bVar10 * (int)auVar18._4_4_ |
                                                                (uint)!bVar10 * auVar75._4_4_,
                                                                (uint)(bVar58 & 1) *
                                                                (int)auVar18._0_4_ |
                                                                (uint)!(bool)(bVar58 & 1) *
                                                                auVar75._0_4_)))),auVar82);
      auVar184 = ZEXT3264(auVar96);
      auVar99 = vsubps_avx512vl(auVar106,auVar88);
      auVar100 = vsubps_avx(auVar81,auVar102);
      auVar191 = ZEXT3264(auVar100);
      auVar98 = vsubps_avx(auVar82,auVar103);
      auVar95 = vsubps_avx512vl(auVar88,auVar104);
      auVar84._4_4_ = auVar99._4_4_ * fVar122;
      auVar84._0_4_ = auVar99._0_4_ * fVar69;
      auVar84._8_4_ = auVar99._8_4_ * fVar126;
      auVar84._12_4_ = auVar99._12_4_ * fVar130;
      auVar84._16_4_ = auVar99._16_4_ * 0.0;
      auVar84._20_4_ = auVar99._20_4_ * 0.0;
      auVar84._24_4_ = auVar99._24_4_ * 0.0;
      auVar84._28_4_ = auVar106._28_4_;
      auVar83 = vfmsub231ps_avx512vl(auVar84,auVar88,auVar97);
      auVar85._4_4_ = fVar123 * auVar97._4_4_;
      auVar85._0_4_ = fVar70 * auVar97._0_4_;
      auVar85._8_4_ = fVar127 * auVar97._8_4_;
      auVar85._12_4_ = fVar131 * auVar97._12_4_;
      auVar85._16_4_ = auVar97._16_4_ * 0.0;
      auVar85._20_4_ = auVar97._20_4_ * 0.0;
      auVar85._24_4_ = auVar97._24_4_ * 0.0;
      auVar85._28_4_ = auVar94._28_4_;
      auVar76 = vfmsub231ps_fma(auVar85,auVar81,auVar96);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar92,auVar83);
      auVar83 = vmulps_avx512vl(auVar96,auVar88);
      auVar76 = vfmsub231ps_fma(auVar83,auVar82,auVar99);
      auVar83 = vfmadd231ps_avx512vl(auVar94,auVar92,ZEXT1632(auVar76));
      auVar94 = vmulps_avx512vl(auVar95,auVar102);
      auVar94 = vfmsub231ps_avx512vl(auVar94,auVar100,auVar104);
      auVar86._4_4_ = auVar98._4_4_ * auVar104._4_4_;
      auVar86._0_4_ = auVar98._0_4_ * auVar104._0_4_;
      auVar86._8_4_ = auVar98._8_4_ * auVar104._8_4_;
      auVar86._12_4_ = auVar98._12_4_ * auVar104._12_4_;
      auVar86._16_4_ = auVar98._16_4_ * auVar104._16_4_;
      auVar86._20_4_ = auVar98._20_4_ * auVar104._20_4_;
      auVar86._24_4_ = auVar98._24_4_ * auVar104._24_4_;
      auVar86._28_4_ = auVar104._28_4_;
      auVar76 = vfmsub231ps_fma(auVar86,auVar103,auVar95);
      auVar175._0_4_ = auVar103._0_4_ * auVar100._0_4_;
      auVar175._4_4_ = auVar103._4_4_ * auVar100._4_4_;
      auVar175._8_4_ = auVar103._8_4_ * auVar100._8_4_;
      auVar175._12_4_ = auVar103._12_4_ * auVar100._12_4_;
      auVar175._16_4_ = fVar145 * auVar100._16_4_;
      auVar175._20_4_ = fVar144 * auVar100._20_4_;
      auVar175._24_4_ = fVar163 * auVar100._24_4_;
      auVar175._28_4_ = 0;
      auVar74 = vfmsub231ps_fma(auVar175,auVar98,auVar102);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar92,auVar94);
      auVar84 = vfmadd231ps_avx512vl(auVar94,auVar92,ZEXT1632(auVar76));
      auVar178 = ZEXT3264(auVar84);
      auVar94 = vmaxps_avx(auVar83,auVar84);
      uVar20 = vcmpps_avx512vl(auVar94,auVar92,2);
      bVar68 = bVar68 & (byte)uVar20;
      if (bVar68 != 0) {
        auVar33._4_4_ = auVar95._4_4_ * auVar96._4_4_;
        auVar33._0_4_ = auVar95._0_4_ * auVar96._0_4_;
        auVar33._8_4_ = auVar95._8_4_ * auVar96._8_4_;
        auVar33._12_4_ = auVar95._12_4_ * auVar96._12_4_;
        auVar33._16_4_ = auVar95._16_4_ * auVar96._16_4_;
        auVar33._20_4_ = auVar95._20_4_ * auVar96._20_4_;
        auVar33._24_4_ = auVar95._24_4_ * auVar96._24_4_;
        auVar33._28_4_ = auVar94._28_4_;
        auVar16 = vfmsub231ps_fma(auVar33,auVar98,auVar99);
        auVar34._4_4_ = auVar99._4_4_ * auVar100._4_4_;
        auVar34._0_4_ = auVar99._0_4_ * auVar100._0_4_;
        auVar34._8_4_ = auVar99._8_4_ * auVar100._8_4_;
        auVar34._12_4_ = auVar99._12_4_ * auVar100._12_4_;
        auVar34._16_4_ = auVar99._16_4_ * auVar100._16_4_;
        auVar34._20_4_ = auVar99._20_4_ * auVar100._20_4_;
        auVar34._24_4_ = auVar99._24_4_ * auVar100._24_4_;
        auVar34._28_4_ = auVar99._28_4_;
        auVar75 = vfmsub231ps_fma(auVar34,auVar97,auVar95);
        auVar35._4_4_ = auVar98._4_4_ * auVar97._4_4_;
        auVar35._0_4_ = auVar98._0_4_ * auVar97._0_4_;
        auVar35._8_4_ = auVar98._8_4_ * auVar97._8_4_;
        auVar35._12_4_ = auVar98._12_4_ * auVar97._12_4_;
        auVar35._16_4_ = auVar98._16_4_ * auVar97._16_4_;
        auVar35._20_4_ = auVar98._20_4_ * auVar97._20_4_;
        auVar35._24_4_ = auVar98._24_4_ * auVar97._24_4_;
        auVar35._28_4_ = auVar98._28_4_;
        auVar77 = vfmsub231ps_fma(auVar35,auVar100,auVar96);
        auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar75),ZEXT1632(auVar77));
        auVar74 = vfmadd231ps_fma(ZEXT1632(auVar76),ZEXT1632(auVar16),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar94 = vrcp14ps_avx512vl(ZEXT1632(auVar74));
        auVar191 = ZEXT3264(auVar94);
        auVar25._8_4_ = 0x3f800000;
        auVar25._0_8_ = 0x3f8000003f800000;
        auVar25._12_4_ = 0x3f800000;
        auVar25._16_4_ = 0x3f800000;
        auVar25._20_4_ = 0x3f800000;
        auVar25._24_4_ = 0x3f800000;
        auVar25._28_4_ = 0x3f800000;
        auVar96 = vfnmadd213ps_avx512vl(auVar94,ZEXT1632(auVar74),auVar25);
        auVar76 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
        auVar184 = ZEXT1664(auVar76);
        auVar94 = vmulps_avx512vl(auVar88,ZEXT1632(auVar77));
        auVar75 = vfmadd231ps_fma(auVar94,auVar82,ZEXT1632(auVar75));
        auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar81,ZEXT1632(auVar16));
        fVar144 = auVar76._0_4_;
        fVar145 = auVar76._4_4_;
        fVar69 = auVar76._8_4_;
        fVar70 = auVar76._12_4_;
        local_280 = ZEXT1632(CONCAT412(auVar75._12_4_ * fVar70,
                                       CONCAT48(auVar75._8_4_ * fVar69,
                                                CONCAT44(auVar75._4_4_ * fVar145,
                                                         auVar75._0_4_ * fVar144))));
        auVar198 = ZEXT3264(local_280);
        auVar137._8_4_ = 3;
        auVar137._0_8_ = 0x300000003;
        auVar137._12_4_ = 3;
        auVar137._16_4_ = 3;
        auVar137._20_4_ = 3;
        auVar137._24_4_ = 3;
        auVar137._28_4_ = 3;
        auVar94 = vpermps_avx2(auVar137,ZEXT1632((undefined1  [16])aVar5));
        uVar20 = vcmpps_avx512vl(auVar94,local_280,2);
        fVar163 = (ray->super_RayK<1>).tfar;
        auVar26._4_4_ = fVar163;
        auVar26._0_4_ = fVar163;
        auVar26._8_4_ = fVar163;
        auVar26._12_4_ = fVar163;
        auVar26._16_4_ = fVar163;
        auVar26._20_4_ = fVar163;
        auVar26._24_4_ = fVar163;
        auVar26._28_4_ = fVar163;
        uVar22 = vcmpps_avx512vl(local_280,auVar26,2);
        bVar68 = (byte)uVar20 & (byte)uVar22 & bVar68;
        if (bVar68 != 0) {
          uVar63 = vcmpps_avx512vl(ZEXT1632(auVar74),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar63 = bVar68 & uVar63;
          if ((char)uVar63 != '\0') {
            fVar163 = auVar83._0_4_ * fVar144;
            fVar122 = auVar83._4_4_ * fVar145;
            auVar36._4_4_ = fVar122;
            auVar36._0_4_ = fVar163;
            fVar123 = auVar83._8_4_ * fVar69;
            auVar36._8_4_ = fVar123;
            fVar126 = auVar83._12_4_ * fVar70;
            auVar36._12_4_ = fVar126;
            fVar127 = auVar83._16_4_ * 0.0;
            auVar36._16_4_ = fVar127;
            fVar130 = auVar83._20_4_ * 0.0;
            auVar36._20_4_ = fVar130;
            fVar131 = auVar83._24_4_ * 0.0;
            auVar36._24_4_ = fVar131;
            auVar36._28_4_ = auVar83._28_4_;
            auVar138._8_4_ = 0x3f800000;
            auVar138._0_8_ = 0x3f8000003f800000;
            auVar138._12_4_ = 0x3f800000;
            auVar138._16_4_ = 0x3f800000;
            auVar138._20_4_ = 0x3f800000;
            auVar138._24_4_ = 0x3f800000;
            auVar138._28_4_ = 0x3f800000;
            auVar94 = vsubps_avx(auVar138,auVar36);
            local_2c0._0_4_ =
                 (float)((uint)(bVar58 & 1) * (int)fVar163 |
                        (uint)!(bool)(bVar58 & 1) * auVar94._0_4_);
            bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar10 * (int)fVar122 | (uint)!bVar10 * auVar94._4_4_);
            bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar10 * (int)fVar123 | (uint)!bVar10 * auVar94._8_4_);
            bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar10 * (int)fVar126 | (uint)!bVar10 * auVar94._12_4_)
            ;
            bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
            local_2c0._16_4_ = (float)((uint)bVar10 * (int)fVar127 | (uint)!bVar10 * auVar94._16_4_)
            ;
            bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
            local_2c0._20_4_ = (float)((uint)bVar10 * (int)fVar130 | (uint)!bVar10 * auVar94._20_4_)
            ;
            bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
            local_2c0._24_4_ = (float)((uint)bVar10 * (int)fVar131 | (uint)!bVar10 * auVar94._24_4_)
            ;
            bVar10 = SUB81(uVar59 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar10 * auVar83._28_4_ | (uint)!bVar10 * auVar94._28_4_);
            auVar94 = vsubps_avx(auVar91,auVar90);
            auVar76 = vfmadd213ps_fma(auVar94,local_2c0,auVar90);
            fVar163 = pre->depth_scale;
            auVar90._4_4_ = fVar163;
            auVar90._0_4_ = fVar163;
            auVar90._8_4_ = fVar163;
            auVar90._12_4_ = fVar163;
            auVar90._16_4_ = fVar163;
            auVar90._20_4_ = fVar163;
            auVar90._24_4_ = fVar163;
            auVar90._28_4_ = fVar163;
            auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                         CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                                  CONCAT44(auVar76._4_4_ +
                                                                           auVar76._4_4_,
                                                                           auVar76._0_4_ +
                                                                           auVar76._0_4_)))),auVar90
                                     );
            uVar21 = vcmpps_avx512vl(local_280,auVar94,6);
            uVar63 = uVar63 & uVar21;
            bVar68 = (byte)uVar63;
            if (bVar68 != 0) {
              auVar161._0_4_ = auVar84._0_4_ * fVar144;
              auVar161._4_4_ = auVar84._4_4_ * fVar145;
              auVar161._8_4_ = auVar84._8_4_ * fVar69;
              auVar161._12_4_ = auVar84._12_4_ * fVar70;
              auVar161._16_4_ = auVar84._16_4_ * 0.0;
              auVar161._20_4_ = auVar84._20_4_ * 0.0;
              auVar161._24_4_ = auVar84._24_4_ * 0.0;
              auVar161._28_4_ = 0;
              auVar170._8_4_ = 0x3f800000;
              auVar170._0_8_ = 0x3f8000003f800000;
              auVar170._12_4_ = 0x3f800000;
              auVar170._16_4_ = 0x3f800000;
              auVar170._20_4_ = 0x3f800000;
              auVar170._24_4_ = 0x3f800000;
              auVar170._28_4_ = 0x3f800000;
              auVar94 = vsubps_avx(auVar170,auVar161);
              auVar107._0_4_ =
                   (uint)(bVar58 & 1) * (int)auVar161._0_4_ |
                   (uint)!(bool)(bVar58 & 1) * auVar94._0_4_;
              bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
              auVar107._4_4_ = (uint)bVar10 * (int)auVar161._4_4_ | (uint)!bVar10 * auVar94._4_4_;
              bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
              auVar107._8_4_ = (uint)bVar10 * (int)auVar161._8_4_ | (uint)!bVar10 * auVar94._8_4_;
              bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
              auVar107._12_4_ = (uint)bVar10 * (int)auVar161._12_4_ | (uint)!bVar10 * auVar94._12_4_
              ;
              bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
              auVar107._16_4_ = (uint)bVar10 * (int)auVar161._16_4_ | (uint)!bVar10 * auVar94._16_4_
              ;
              bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
              auVar107._20_4_ = (uint)bVar10 * (int)auVar161._20_4_ | (uint)!bVar10 * auVar94._20_4_
              ;
              bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
              auVar107._24_4_ = (uint)bVar10 * (int)auVar161._24_4_ | (uint)!bVar10 * auVar94._24_4_
              ;
              auVar107._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar94._28_4_;
              auVar91._8_4_ = 0x40000000;
              auVar91._0_8_ = 0x4000000040000000;
              auVar91._12_4_ = 0x40000000;
              auVar91._16_4_ = 0x40000000;
              auVar91._20_4_ = 0x40000000;
              auVar91._24_4_ = 0x40000000;
              auVar91._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar107,auVar170,auVar91);
              local_260 = 0;
              local_25c = iVar8;
              auVar191 = ZEXT1664(local_4b0);
              local_250 = local_4b0;
              auVar193 = ZEXT1664(local_4c0);
              local_240 = local_4c0;
              local_230 = *(undefined8 *)*pauVar3;
              uStack_228 = *(undefined8 *)(*pauVar3 + 8);
              if ((pGVar65->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar163 = 1.0 / auVar89._0_4_;
                local_200[0] = fVar163 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar163 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar163 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar163 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar163 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar163 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar163 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = local_280;
                auVar139._8_4_ = 0x7f800000;
                auVar139._0_8_ = 0x7f8000007f800000;
                auVar139._12_4_ = 0x7f800000;
                auVar139._16_4_ = 0x7f800000;
                auVar139._20_4_ = 0x7f800000;
                auVar139._24_4_ = 0x7f800000;
                auVar139._28_4_ = 0x7f800000;
                auVar94 = vblendmps_avx512vl(auVar139,local_280);
                auVar108._0_4_ =
                     (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000;
                bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
                auVar108._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
                auVar108._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
                auVar108._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar63 >> 4) & 1);
                auVar108._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
                auVar108._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
                auVar108._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = SUB81(uVar63 >> 7,0);
                auVar108._28_4_ = (uint)bVar10 * auVar94._28_4_ | (uint)!bVar10 * 0x7f800000;
                auVar94 = vshufps_avx(auVar108,auVar108,0xb1);
                auVar94 = vminps_avx(auVar108,auVar94);
                auVar96 = vshufpd_avx(auVar94,auVar94,5);
                auVar94 = vminps_avx(auVar94,auVar96);
                auVar96 = vpermpd_avx2(auVar94,0x4e);
                auVar94 = vminps_avx(auVar94,auVar96);
                uVar20 = vcmpps_avx512vl(auVar108,auVar94,0);
                uVar60 = (uint)uVar63;
                if ((bVar68 & (byte)uVar20) != 0) {
                  uVar60 = (uint)(bVar68 & (byte)uVar20);
                }
                uVar23 = 0;
                for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
                  uVar23 = uVar23 + 1;
                }
                uVar59 = (ulong)uVar23;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar65->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_400 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_420 = local_280;
                  do {
                    local_494 = local_200[uVar59];
                    local_490 = *(undefined4 *)(local_1e0 + uVar59 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar59 * 4);
                    local_4f0.context = context->user;
                    fVar144 = 1.0 - local_494;
                    fVar163 = fVar144 * fVar144 * -3.0;
                    auVar178 = ZEXT464((uint)fVar163);
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144)),
                                              ZEXT416((uint)(local_494 * fVar144)),
                                              ZEXT416(0xc0000000));
                    auVar74 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar144)),
                                              ZEXT416((uint)(local_494 * local_494)),
                                              ZEXT416(0x40000000));
                    fVar144 = auVar76._0_4_ * 3.0;
                    fVar145 = auVar74._0_4_ * 3.0;
                    fVar69 = local_494 * local_494 * 3.0;
                    auVar183._0_4_ = fVar69 * local_530;
                    auVar183._4_4_ = fVar69 * fStack_52c;
                    auVar183._8_4_ = fVar69 * fStack_528;
                    auVar183._12_4_ = fVar69 * fStack_524;
                    auVar184 = ZEXT1664(auVar183);
                    auVar159._4_4_ = fVar145;
                    auVar159._0_4_ = fVar145;
                    auVar159._8_4_ = fVar145;
                    auVar159._12_4_ = fVar145;
                    auVar57._8_8_ = uStack_518;
                    auVar57._0_8_ = local_520;
                    auVar76 = vfmadd132ps_fma(auVar159,auVar183,auVar57);
                    auVar169._4_4_ = fVar144;
                    auVar169._0_4_ = fVar144;
                    auVar169._8_4_ = fVar144;
                    auVar169._12_4_ = fVar144;
                    auVar76 = vfmadd213ps_fma(auVar169,auVar193._0_16_,auVar76);
                    auVar160._4_4_ = fVar163;
                    auVar160._0_4_ = fVar163;
                    auVar160._8_4_ = fVar163;
                    auVar160._12_4_ = fVar163;
                    auVar76 = vfmadd213ps_fma(auVar160,auVar191._0_16_,auVar76);
                    local_4a0 = vmovlps_avx(auVar76);
                    local_498 = vextractps_avx(auVar76,2);
                    local_48c = (int)local_538;
                    local_488 = (int)local_550;
                    local_484 = (local_4f0.context)->instID[0];
                    local_480 = (local_4f0.context)->instPrimID[0];
                    local_554 = -1;
                    local_4f0.valid = &local_554;
                    local_4f0.geometryUserPtr = pGVar65->userPtr;
                    local_4f0.ray = (RTCRayN *)ray;
                    local_4f0.hit = (RTCHitN *)&local_4a0;
                    local_4f0.N = 1;
                    if (pGVar65->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01835223:
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar178 = ZEXT1664(auVar178._0_16_);
                        auVar184 = ZEXT1664(auVar184._0_16_);
                        (*p_Var9)(&local_4f0);
                        auVar198 = ZEXT3264(local_420);
                        auVar193 = ZEXT1664(local_4c0);
                        auVar191 = ZEXT1664(local_4b0);
                        context = local_548;
                        ray = local_540;
                        if (*local_4f0.valid == 0) goto LAB_018352d1;
                      }
                      (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).components[0] =
                           *(float *)local_4f0.hit;
                      (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_4f0.hit + 4);
                      (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_4f0.hit + 8);
                      *(float *)((long)local_4f0.ray + 0x3c) = *(float *)(local_4f0.hit + 0xc);
                      *(float *)((long)local_4f0.ray + 0x40) = *(float *)(local_4f0.hit + 0x10);
                      *(float *)((long)local_4f0.ray + 0x44) = *(float *)(local_4f0.hit + 0x14);
                      *(float *)((long)local_4f0.ray + 0x48) = *(float *)(local_4f0.hit + 0x18);
                      *(float *)((long)local_4f0.ray + 0x4c) = *(float *)(local_4f0.hit + 0x1c);
                      *(float *)((long)local_4f0.ray + 0x50) = *(float *)(local_4f0.hit + 0x20);
                    }
                    else {
                      auVar178 = ZEXT464((uint)fVar163);
                      auVar184 = ZEXT1664(auVar183);
                      (*pGVar65->intersectionFilterN)(&local_4f0);
                      auVar198 = ZEXT3264(local_420);
                      auVar193 = ZEXT1664(local_4c0);
                      auVar191 = ZEXT1664(local_4b0);
                      context = local_548;
                      ray = local_540;
                      if (*local_4f0.valid != 0) goto LAB_01835223;
LAB_018352d1:
                      (local_540->super_RayK<1>).tfar = (float)local_400._0_4_;
                      context = local_548;
                      ray = local_540;
                    }
                    bVar68 = ~(byte)(1 << ((uint)uVar59 & 0x1f)) & (byte)uVar63;
                    fVar163 = (ray->super_RayK<1>).tfar;
                    auVar32._4_4_ = fVar163;
                    auVar32._0_4_ = fVar163;
                    auVar32._8_4_ = fVar163;
                    auVar32._12_4_ = fVar163;
                    auVar32._16_4_ = fVar163;
                    auVar32._20_4_ = fVar163;
                    auVar32._24_4_ = fVar163;
                    auVar32._28_4_ = fVar163;
                    uVar20 = vcmpps_avx512vl(auVar198._0_32_,auVar32,2);
                    pre = local_508;
                    prim = local_500;
                    if ((bVar68 & (byte)uVar20) == 0) goto LAB_01834482;
                    local_400 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar68 = bVar68 & (byte)uVar20;
                    uVar63 = (ulong)bVar68;
                    auVar143._8_4_ = 0x7f800000;
                    auVar143._0_8_ = 0x7f8000007f800000;
                    auVar143._12_4_ = 0x7f800000;
                    auVar143._16_4_ = 0x7f800000;
                    auVar143._20_4_ = 0x7f800000;
                    auVar143._24_4_ = 0x7f800000;
                    auVar143._28_4_ = 0x7f800000;
                    auVar94 = vblendmps_avx512vl(auVar143,auVar198._0_32_);
                    auVar121._0_4_ =
                         (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000
                    ;
                    bVar10 = (bool)(bVar68 >> 1 & 1);
                    auVar121._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar68 >> 2 & 1);
                    auVar121._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar68 >> 3 & 1);
                    auVar121._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar68 >> 4 & 1);
                    auVar121._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar68 >> 5 & 1);
                    auVar121._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)(bVar68 >> 6 & 1);
                    auVar121._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * 0x7f800000;
                    auVar121._28_4_ =
                         (uint)(bVar68 >> 7) * auVar94._28_4_ |
                         (uint)!(bool)(bVar68 >> 7) * 0x7f800000;
                    auVar94 = vshufps_avx(auVar121,auVar121,0xb1);
                    auVar94 = vminps_avx(auVar121,auVar94);
                    auVar96 = vshufpd_avx(auVar94,auVar94,5);
                    auVar94 = vminps_avx(auVar94,auVar96);
                    auVar96 = vpermpd_avx2(auVar94,0x4e);
                    auVar94 = vminps_avx(auVar94,auVar96);
                    uVar20 = vcmpps_avx512vl(auVar121,auVar94,0);
                    bVar58 = (byte)uVar20 & bVar68;
                    if (bVar58 != 0) {
                      bVar68 = bVar58;
                    }
                    uVar61 = 0;
                    for (uVar62 = (uint)bVar68; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000
                        ) {
                      uVar61 = uVar61 + 1;
                    }
                    uVar59 = (ulong)uVar61;
                  } while( true );
                }
                fVar163 = local_200[uVar59];
                fVar144 = *(float *)(local_1e0 + uVar59 * 4);
                fVar69 = 1.0 - fVar163;
                fVar145 = fVar69 * fVar69 * -3.0;
                auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar69 * fVar69)),
                                          ZEXT416((uint)(fVar163 * fVar69)),ZEXT416(0xc0000000));
                auVar74 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar69)),
                                          ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000));
                fVar69 = auVar76._0_4_ * 3.0;
                fVar70 = auVar74._0_4_ * 3.0;
                fVar122 = fVar163 * fVar163 * 3.0;
                auVar180._0_4_ = fVar122 * local_530;
                auVar180._4_4_ = fVar122 * fStack_52c;
                auVar180._8_4_ = fVar122 * fStack_528;
                auVar180._12_4_ = fVar122 * fStack_524;
                auVar184 = ZEXT1664(auVar180);
                auVar153._4_4_ = fVar70;
                auVar153._0_4_ = fVar70;
                auVar153._8_4_ = fVar70;
                auVar153._12_4_ = fVar70;
                auVar76 = vfmadd132ps_fma(auVar153,auVar180,*pauVar3);
                auVar166._4_4_ = fVar69;
                auVar166._0_4_ = fVar69;
                auVar166._8_4_ = fVar69;
                auVar166._12_4_ = fVar69;
                auVar76 = vfmadd213ps_fma(auVar166,local_4c0,auVar76);
                auVar154._4_4_ = fVar145;
                auVar154._0_4_ = fVar145;
                auVar154._8_4_ = fVar145;
                auVar154._12_4_ = fVar145;
                auVar178 = ZEXT464((uint)*(float *)(local_1c0 + uVar59 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar59 * 4);
                auVar76 = vfmadd213ps_fma(auVar154,local_4b0,auVar76);
                uVar20 = vmovlps_avx(auVar76);
                *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                fVar145 = (float)vextractps_avx(auVar76,2);
                (ray->Ng).field_0.field_0.z = fVar145;
                ray->u = fVar163;
                ray->v = fVar144;
                ray->primID = uVar62;
                ray->geomID = uVar61;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                pre = local_508;
                prim = local_500;
              }
            }
          }
        }
      }
    }
LAB_01834482:
    if (8 < iVar8) {
      local_400 = vpbroadcastd_avx512vl();
      local_420._4_4_ = local_440._0_4_;
      local_420._0_4_ = local_440._0_4_;
      local_420._8_4_ = local_440._0_4_;
      local_420._12_4_ = local_440._0_4_;
      local_420._16_4_ = local_440._0_4_;
      local_420._20_4_ = local_440._0_4_;
      local_420._24_4_ = local_440._0_4_;
      local_420._28_4_ = local_440._0_4_;
      auVar140._8_4_ = 3;
      auVar140._0_8_ = 0x300000003;
      auVar140._12_4_ = 3;
      auVar140._16_4_ = 3;
      auVar140._20_4_ = 3;
      auVar140._24_4_ = 3;
      auVar140._28_4_ = 3;
      local_3e0 = vpermps_avx2(auVar140,local_3e0);
      local_100 = 1.0 / (float)local_460._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      for (lVar66 = 8; lVar66 < local_4f8; lVar66 = lVar66 + 8) {
        auVar94 = vpbroadcastd_avx512vl();
        auVar94 = vpor_avx2(auVar94,_DAT_01fb4ba0);
        uVar22 = vpcmpd_avx512vl(auVar94,local_400,1);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 * 4 + lVar64);
        auVar96 = *(undefined1 (*) [32])(lVar64 + 0x21fb768 + lVar66 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar64 + 0x21fbbec + lVar66 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar64 + 0x21fc070 + lVar66 * 4);
        auVar198._0_4_ = auVar98._0_4_ * (float)local_3a0._0_4_;
        auVar198._4_4_ = auVar98._4_4_ * (float)local_3a0._4_4_;
        auVar198._8_4_ = auVar98._8_4_ * fStack_398;
        auVar198._12_4_ = auVar98._12_4_ * fStack_394;
        auVar198._16_4_ = auVar98._16_4_ * fStack_390;
        auVar198._20_4_ = auVar98._20_4_ * fStack_38c;
        auVar198._28_36_ = auVar184._28_36_;
        auVar198._24_4_ = auVar98._24_4_ * fStack_388;
        auVar184._0_4_ = auVar98._0_4_ * (float)local_3c0._0_4_;
        auVar184._4_4_ = auVar98._4_4_ * (float)local_3c0._4_4_;
        auVar184._8_4_ = auVar98._8_4_ * fStack_3b8;
        auVar184._12_4_ = auVar98._12_4_ * fStack_3b4;
        auVar184._16_4_ = auVar98._16_4_ * fStack_3b0;
        auVar184._20_4_ = auVar98._20_4_ * fStack_3ac;
        auVar184._28_36_ = auVar178._28_36_;
        auVar184._24_4_ = auVar98._24_4_ * fStack_3a8;
        auVar97 = vmulps_avx512vl(local_e0,auVar98);
        auVar81 = vfmadd231ps_avx512vl(auVar198._0_32_,auVar100,local_360);
        auVar82 = vfmadd231ps_avx512vl(auVar184._0_32_,auVar100,local_380);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_c0);
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar96,local_320);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar96,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar97,auVar96,local_a0);
        auVar76 = vfmadd231ps_fma(auVar81,auVar94,local_2e0);
        auVar184 = ZEXT1664(auVar76);
        auVar74 = vfmadd231ps_fma(auVar82,auVar94,local_300);
        auVar178 = ZEXT1664(auVar74);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 * 4 + lVar64);
        auVar81 = *(undefined1 (*) [32])(lVar64 + 0x21fdb88 + lVar66 * 4);
        auVar84 = vfmadd231ps_avx512vl(auVar99,auVar94,local_80);
        auVar82 = *(undefined1 (*) [32])(lVar64 + 0x21fe00c + lVar66 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar64 + 0x21fe490 + lVar66 * 4);
        auVar193._0_4_ = auVar99._0_4_ * (float)local_3a0._0_4_;
        auVar193._4_4_ = auVar99._4_4_ * (float)local_3a0._4_4_;
        auVar193._8_4_ = auVar99._8_4_ * fStack_398;
        auVar193._12_4_ = auVar99._12_4_ * fStack_394;
        auVar193._16_4_ = auVar99._16_4_ * fStack_390;
        auVar193._20_4_ = auVar99._20_4_ * fStack_38c;
        auVar193._28_36_ = auVar191._28_36_;
        auVar193._24_4_ = auVar99._24_4_ * fStack_388;
        auVar37._4_4_ = auVar99._4_4_ * (float)local_3c0._4_4_;
        auVar37._0_4_ = auVar99._0_4_ * (float)local_3c0._0_4_;
        auVar37._8_4_ = auVar99._8_4_ * fStack_3b8;
        auVar37._12_4_ = auVar99._12_4_ * fStack_3b4;
        auVar37._16_4_ = auVar99._16_4_ * fStack_3b0;
        auVar37._20_4_ = auVar99._20_4_ * fStack_3ac;
        auVar37._24_4_ = auVar99._24_4_ * fStack_3a8;
        auVar37._28_4_ = uStack_3a4;
        auVar95 = vmulps_avx512vl(local_e0,auVar99);
        auVar83 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar82,local_360);
        auVar85 = vfmadd231ps_avx512vl(auVar37,auVar82,local_380);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar82,local_c0);
        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar81,local_320);
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar81,local_a0);
        auVar75 = vfmadd231ps_fma(auVar83,auVar97,local_2e0);
        auVar191 = ZEXT1664(auVar75);
        auVar16 = vfmadd231ps_fma(auVar85,auVar97,local_300);
        auVar85 = vfmadd231ps_avx512vl(auVar95,auVar97,local_80);
        auVar86 = vmaxps_avx512vl(auVar84,auVar85);
        auVar95 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar76));
        auVar83 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar74));
        auVar87 = vmulps_avx512vl(ZEXT1632(auVar74),auVar95);
        auVar88 = vmulps_avx512vl(ZEXT1632(auVar76),auVar83);
        auVar87 = vsubps_avx512vl(auVar87,auVar88);
        auVar88 = vmulps_avx512vl(auVar83,auVar83);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,auVar95);
        auVar86 = vmulps_avx512vl(auVar86,auVar86);
        auVar86 = vmulps_avx512vl(auVar86,auVar88);
        auVar87 = vmulps_avx512vl(auVar87,auVar87);
        uVar20 = vcmpps_avx512vl(auVar87,auVar86,2);
        bVar68 = (byte)uVar22 & (byte)uVar20;
        if (bVar68 != 0) {
          auVar99 = vmulps_avx512vl(local_180,auVar99);
          auVar82 = vfmadd213ps_avx512vl(auVar82,local_160,auVar99);
          auVar81 = vfmadd213ps_avx512vl(auVar81,local_140,auVar82);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar81);
          auVar98 = vmulps_avx512vl(local_180,auVar98);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar98);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar100);
          auVar81 = vfmadd213ps_avx512vl(auVar94,local_120,auVar96);
          auVar94 = *(undefined1 (*) [32])(lVar64 + 0x21fc4f4 + lVar66 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar64 + 0x21fc978 + lVar66 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar64 + 0x21fcdfc + lVar66 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar64 + 0x21fd280 + lVar66 * 4);
          auVar82 = vmulps_avx512vl(_local_3a0,auVar98);
          auVar99 = vmulps_avx512vl(_local_3c0,auVar98);
          auVar98 = vmulps_avx512vl(local_180,auVar98);
          auVar82 = vfmadd231ps_avx512vl(auVar82,auVar100,local_360);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar100,local_380);
          auVar100 = vfmadd231ps_avx512vl(auVar98,local_160,auVar100);
          auVar98 = vfmadd231ps_avx512vl(auVar82,auVar96,local_320);
          auVar82 = vfmadd231ps_avx512vl(auVar99,auVar96,local_340);
          auVar96 = vfmadd231ps_avx512vl(auVar100,local_140,auVar96);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_2e0);
          auVar82 = vfmadd231ps_avx512vl(auVar82,auVar94,local_300);
          auVar99 = vfmadd231ps_avx512vl(auVar96,local_120,auVar94);
          auVar94 = *(undefined1 (*) [32])(lVar64 + 0x21fe914 + lVar66 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar64 + 0x21ff21c + lVar66 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar64 + 0x21ff6a0 + lVar66 * 4);
          auVar86 = vmulps_avx512vl(_local_3a0,auVar100);
          auVar87 = vmulps_avx512vl(_local_3c0,auVar100);
          auVar100 = vmulps_avx512vl(local_180,auVar100);
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar96,local_360);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar96,local_380);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_160,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar64 + 0x21fed98 + lVar66 * 4);
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar96,local_320);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar96,local_340);
          auVar96 = vfmadd231ps_avx512vl(auVar100,local_140,auVar96);
          auVar100 = vfmadd231ps_avx512vl(auVar86,auVar94,local_2e0);
          auVar86 = vfmadd231ps_avx512vl(auVar87,auVar94,local_300);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_120,auVar94);
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar98,auVar87);
          vandps_avx512vl(auVar82,auVar87);
          auVar94 = vmaxps_avx(auVar87,auVar87);
          vandps_avx512vl(auVar99,auVar87);
          auVar94 = vmaxps_avx(auVar94,auVar87);
          uVar59 = vcmpps_avx512vl(auVar94,local_420,1);
          bVar10 = (bool)((byte)uVar59 & 1);
          auVar109._0_4_ = (float)((uint)bVar10 * auVar95._0_4_ | (uint)!bVar10 * auVar98._0_4_);
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar109._4_4_ = (float)((uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar98._4_4_);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar109._8_4_ = (float)((uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar98._8_4_);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar109._12_4_ = (float)((uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar98._12_4_);
          bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar109._16_4_ = (float)((uint)bVar10 * auVar95._16_4_ | (uint)!bVar10 * auVar98._16_4_);
          bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar109._20_4_ = (float)((uint)bVar10 * auVar95._20_4_ | (uint)!bVar10 * auVar98._20_4_);
          bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar109._24_4_ = (float)((uint)bVar10 * auVar95._24_4_ | (uint)!bVar10 * auVar98._24_4_);
          bVar10 = SUB81(uVar59 >> 7,0);
          auVar109._28_4_ = (uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar98._28_4_;
          bVar10 = (bool)((byte)uVar59 & 1);
          auVar110._0_4_ = (float)((uint)bVar10 * auVar83._0_4_ | (uint)!bVar10 * auVar82._0_4_);
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar110._4_4_ = (float)((uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * auVar82._4_4_);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar110._8_4_ = (float)((uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * auVar82._8_4_);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar110._12_4_ = (float)((uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * auVar82._12_4_);
          bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar110._16_4_ = (float)((uint)bVar10 * auVar83._16_4_ | (uint)!bVar10 * auVar82._16_4_);
          bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar110._20_4_ = (float)((uint)bVar10 * auVar83._20_4_ | (uint)!bVar10 * auVar82._20_4_);
          bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar110._24_4_ = (float)((uint)bVar10 * auVar83._24_4_ | (uint)!bVar10 * auVar82._24_4_);
          bVar10 = SUB81(uVar59 >> 7,0);
          auVar110._28_4_ = (uint)bVar10 * auVar83._28_4_ | (uint)!bVar10 * auVar82._28_4_;
          vandps_avx512vl(auVar100,auVar87);
          vandps_avx512vl(auVar86,auVar87);
          auVar94 = vmaxps_avx(auVar110,auVar110);
          vandps_avx512vl(auVar96,auVar87);
          auVar94 = vmaxps_avx(auVar94,auVar110);
          uVar59 = vcmpps_avx512vl(auVar94,local_420,1);
          bVar10 = (bool)((byte)uVar59 & 1);
          auVar111._0_4_ = (uint)bVar10 * auVar95._0_4_ | (uint)!bVar10 * auVar100._0_4_;
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar111._4_4_ = (uint)bVar10 * auVar95._4_4_ | (uint)!bVar10 * auVar100._4_4_;
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar111._8_4_ = (uint)bVar10 * auVar95._8_4_ | (uint)!bVar10 * auVar100._8_4_;
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar111._12_4_ = (uint)bVar10 * auVar95._12_4_ | (uint)!bVar10 * auVar100._12_4_;
          bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar111._16_4_ = (uint)bVar10 * auVar95._16_4_ | (uint)!bVar10 * auVar100._16_4_;
          bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar111._20_4_ = (uint)bVar10 * auVar95._20_4_ | (uint)!bVar10 * auVar100._20_4_;
          bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar111._24_4_ = (uint)bVar10 * auVar95._24_4_ | (uint)!bVar10 * auVar100._24_4_;
          bVar10 = SUB81(uVar59 >> 7,0);
          auVar111._28_4_ = (uint)bVar10 * auVar95._28_4_ | (uint)!bVar10 * auVar100._28_4_;
          bVar10 = (bool)((byte)uVar59 & 1);
          auVar112._0_4_ = (float)((uint)bVar10 * auVar83._0_4_ | (uint)!bVar10 * auVar86._0_4_);
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar10 * auVar83._4_4_ | (uint)!bVar10 * auVar86._4_4_);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar10 * auVar83._8_4_ | (uint)!bVar10 * auVar86._8_4_);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar10 * auVar83._12_4_ | (uint)!bVar10 * auVar86._12_4_);
          bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
          auVar112._16_4_ = (float)((uint)bVar10 * auVar83._16_4_ | (uint)!bVar10 * auVar86._16_4_);
          bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
          auVar112._20_4_ = (float)((uint)bVar10 * auVar83._20_4_ | (uint)!bVar10 * auVar86._20_4_);
          bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
          auVar112._24_4_ = (float)((uint)bVar10 * auVar83._24_4_ | (uint)!bVar10 * auVar86._24_4_);
          bVar10 = SUB81(uVar59 >> 7,0);
          auVar112._28_4_ = (uint)bVar10 * auVar83._28_4_ | (uint)!bVar10 * auVar86._28_4_;
          auVar195._8_4_ = 0x80000000;
          auVar195._0_8_ = 0x8000000080000000;
          auVar195._12_4_ = 0x80000000;
          auVar195._16_4_ = 0x80000000;
          auVar195._20_4_ = 0x80000000;
          auVar195._24_4_ = 0x80000000;
          auVar195._28_4_ = 0x80000000;
          auVar94 = vxorps_avx512vl(auVar111,auVar195);
          auVar80 = vxorps_avx512vl(auVar87._0_16_,auVar87._0_16_);
          auVar96 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar80));
          auVar77 = vfmadd231ps_fma(auVar96,auVar110,auVar110);
          auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
          auVar204._8_4_ = 0xbf000000;
          auVar204._0_8_ = 0xbf000000bf000000;
          auVar204._12_4_ = 0xbf000000;
          auVar204._16_4_ = 0xbf000000;
          auVar204._20_4_ = 0xbf000000;
          auVar204._24_4_ = 0xbf000000;
          auVar204._28_4_ = 0xbf000000;
          fVar163 = auVar96._0_4_;
          fVar144 = auVar96._4_4_;
          fVar145 = auVar96._8_4_;
          fVar69 = auVar96._12_4_;
          fVar70 = auVar96._16_4_;
          fVar122 = auVar96._20_4_;
          fVar123 = auVar96._24_4_;
          auVar38._4_4_ = fVar144 * fVar144 * fVar144 * auVar77._4_4_ * -0.5;
          auVar38._0_4_ = fVar163 * fVar163 * fVar163 * auVar77._0_4_ * -0.5;
          auVar38._8_4_ = fVar145 * fVar145 * fVar145 * auVar77._8_4_ * -0.5;
          auVar38._12_4_ = fVar69 * fVar69 * fVar69 * auVar77._12_4_ * -0.5;
          auVar38._16_4_ = fVar70 * fVar70 * fVar70 * -0.0;
          auVar38._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
          auVar38._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
          auVar38._28_4_ = auVar110._28_4_;
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar96 = vfmadd231ps_avx512vl(auVar38,auVar100,auVar96);
          auVar39._4_4_ = auVar110._4_4_ * auVar96._4_4_;
          auVar39._0_4_ = auVar110._0_4_ * auVar96._0_4_;
          auVar39._8_4_ = auVar110._8_4_ * auVar96._8_4_;
          auVar39._12_4_ = auVar110._12_4_ * auVar96._12_4_;
          auVar39._16_4_ = auVar110._16_4_ * auVar96._16_4_;
          auVar39._20_4_ = auVar110._20_4_ * auVar96._20_4_;
          auVar39._24_4_ = auVar110._24_4_ * auVar96._24_4_;
          auVar39._28_4_ = 0;
          auVar40._4_4_ = auVar96._4_4_ * -auVar109._4_4_;
          auVar40._0_4_ = auVar96._0_4_ * -auVar109._0_4_;
          auVar40._8_4_ = auVar96._8_4_ * -auVar109._8_4_;
          auVar40._12_4_ = auVar96._12_4_ * -auVar109._12_4_;
          auVar40._16_4_ = auVar96._16_4_ * -auVar109._16_4_;
          auVar40._20_4_ = auVar96._20_4_ * -auVar109._20_4_;
          auVar40._24_4_ = auVar96._24_4_ * -auVar109._24_4_;
          auVar40._28_4_ = auVar110._28_4_;
          auVar98 = vmulps_avx512vl(auVar96,ZEXT1632(auVar80));
          auVar99 = ZEXT1632(auVar80);
          auVar96 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar99);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar112,auVar112);
          auVar82 = vrsqrt14ps_avx512vl(auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar204);
          fVar163 = auVar82._0_4_;
          fVar144 = auVar82._4_4_;
          fVar145 = auVar82._8_4_;
          fVar69 = auVar82._12_4_;
          fVar70 = auVar82._16_4_;
          fVar122 = auVar82._20_4_;
          fVar123 = auVar82._24_4_;
          auVar41._4_4_ = fVar144 * fVar144 * fVar144 * auVar96._4_4_;
          auVar41._0_4_ = fVar163 * fVar163 * fVar163 * auVar96._0_4_;
          auVar41._8_4_ = fVar145 * fVar145 * fVar145 * auVar96._8_4_;
          auVar41._12_4_ = fVar69 * fVar69 * fVar69 * auVar96._12_4_;
          auVar41._16_4_ = fVar70 * fVar70 * fVar70 * auVar96._16_4_;
          auVar41._20_4_ = fVar122 * fVar122 * fVar122 * auVar96._20_4_;
          auVar41._24_4_ = fVar123 * fVar123 * fVar123 * auVar96._24_4_;
          auVar41._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar41,auVar100,auVar82);
          auVar42._4_4_ = auVar112._4_4_ * auVar96._4_4_;
          auVar42._0_4_ = auVar112._0_4_ * auVar96._0_4_;
          auVar42._8_4_ = auVar112._8_4_ * auVar96._8_4_;
          auVar42._12_4_ = auVar112._12_4_ * auVar96._12_4_;
          auVar42._16_4_ = auVar112._16_4_ * auVar96._16_4_;
          auVar42._20_4_ = auVar112._20_4_ * auVar96._20_4_;
          auVar42._24_4_ = auVar112._24_4_ * auVar96._24_4_;
          auVar42._28_4_ = auVar82._28_4_;
          auVar43._4_4_ = auVar96._4_4_ * auVar94._4_4_;
          auVar43._0_4_ = auVar96._0_4_ * auVar94._0_4_;
          auVar43._8_4_ = auVar96._8_4_ * auVar94._8_4_;
          auVar43._12_4_ = auVar96._12_4_ * auVar94._12_4_;
          auVar43._16_4_ = auVar96._16_4_ * auVar94._16_4_;
          auVar43._20_4_ = auVar96._20_4_ * auVar94._20_4_;
          auVar43._24_4_ = auVar96._24_4_ * auVar94._24_4_;
          auVar43._28_4_ = auVar94._28_4_;
          auVar94 = vmulps_avx512vl(auVar96,auVar99);
          auVar77 = vfmadd213ps_fma(auVar39,auVar84,ZEXT1632(auVar76));
          auVar17 = vfmadd213ps_fma(auVar40,auVar84,ZEXT1632(auVar74));
          auVar100 = vfmadd213ps_avx512vl(auVar98,auVar84,auVar81);
          auVar82 = vfmadd213ps_avx512vl(auVar42,auVar85,ZEXT1632(auVar75));
          auVar19 = vfnmadd213ps_fma(auVar39,auVar84,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar43,auVar85,ZEXT1632(auVar16));
          auVar78 = vfnmadd213ps_fma(auVar40,auVar84,ZEXT1632(auVar74));
          auVar74 = vfmadd213ps_fma(auVar94,auVar85,auVar97);
          auVar73 = vfnmadd231ps_fma(auVar81,auVar84,auVar98);
          auVar79 = vfnmadd213ps_fma(auVar42,auVar85,ZEXT1632(auVar75));
          auVar71 = vfnmadd213ps_fma(auVar43,auVar85,ZEXT1632(auVar16));
          auVar72 = vfnmadd231ps_fma(auVar97,auVar85,auVar94);
          auVar97 = vsubps_avx512vl(auVar82,ZEXT1632(auVar19));
          auVar94 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar78));
          auVar96 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar73));
          auVar44._4_4_ = auVar94._4_4_ * auVar73._4_4_;
          auVar44._0_4_ = auVar94._0_4_ * auVar73._0_4_;
          auVar44._8_4_ = auVar94._8_4_ * auVar73._8_4_;
          auVar44._12_4_ = auVar94._12_4_ * auVar73._12_4_;
          auVar44._16_4_ = auVar94._16_4_ * 0.0;
          auVar44._20_4_ = auVar94._20_4_ * 0.0;
          auVar44._24_4_ = auVar94._24_4_ * 0.0;
          auVar44._28_4_ = auVar98._28_4_;
          auVar75 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar78),auVar96);
          auVar45._4_4_ = auVar96._4_4_ * auVar19._4_4_;
          auVar45._0_4_ = auVar96._0_4_ * auVar19._0_4_;
          auVar45._8_4_ = auVar96._8_4_ * auVar19._8_4_;
          auVar45._12_4_ = auVar96._12_4_ * auVar19._12_4_;
          auVar45._16_4_ = auVar96._16_4_ * 0.0;
          auVar45._20_4_ = auVar96._20_4_ * 0.0;
          auVar45._24_4_ = auVar96._24_4_ * 0.0;
          auVar45._28_4_ = auVar96._28_4_;
          auVar16 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar73),auVar97);
          auVar46._4_4_ = auVar78._4_4_ * auVar97._4_4_;
          auVar46._0_4_ = auVar78._0_4_ * auVar97._0_4_;
          auVar46._8_4_ = auVar78._8_4_ * auVar97._8_4_;
          auVar46._12_4_ = auVar78._12_4_ * auVar97._12_4_;
          auVar46._16_4_ = auVar97._16_4_ * 0.0;
          auVar46._20_4_ = auVar97._20_4_ * 0.0;
          auVar46._24_4_ = auVar97._24_4_ * 0.0;
          auVar46._28_4_ = auVar97._28_4_;
          auVar18 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar19),auVar94);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar99,ZEXT1632(auVar16));
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,ZEXT1632(auVar75));
          auVar87 = ZEXT1632(auVar80);
          uVar59 = vcmpps_avx512vl(auVar94,auVar87,2);
          bVar58 = (byte)uVar59;
          fVar130 = (float)((uint)(bVar58 & 1) * auVar77._0_4_ |
                           (uint)!(bool)(bVar58 & 1) * auVar79._0_4_);
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          fVar124 = (float)((uint)bVar10 * auVar77._4_4_ | (uint)!bVar10 * auVar79._4_4_);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          fVar128 = (float)((uint)bVar10 * auVar77._8_4_ | (uint)!bVar10 * auVar79._8_4_);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          fVar132 = (float)((uint)bVar10 * auVar77._12_4_ | (uint)!bVar10 * auVar79._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar128,CONCAT44(fVar124,fVar130))));
          fVar131 = (float)((uint)(bVar58 & 1) * auVar17._0_4_ |
                           (uint)!(bool)(bVar58 & 1) * auVar71._0_4_);
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          fVar125 = (float)((uint)bVar10 * auVar17._4_4_ | (uint)!bVar10 * auVar71._4_4_);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          fVar129 = (float)((uint)bVar10 * auVar17._8_4_ | (uint)!bVar10 * auVar71._8_4_);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          fVar133 = (float)((uint)bVar10 * auVar17._12_4_ | (uint)!bVar10 * auVar71._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar129,CONCAT44(fVar125,fVar131))));
          auVar113._0_4_ =
               (float)((uint)(bVar58 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar72._0_4_);
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar10 * auVar100._4_4_ | (uint)!bVar10 * auVar72._4_4_);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar10 * auVar100._8_4_ | (uint)!bVar10 * auVar72._8_4_);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar113._12_4_ = (float)((uint)bVar10 * auVar100._12_4_ | (uint)!bVar10 * auVar72._12_4_)
          ;
          fVar144 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar100._16_4_);
          auVar113._16_4_ = fVar144;
          fVar163 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar100._20_4_);
          auVar113._20_4_ = fVar163;
          fVar145 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar100._24_4_);
          auVar113._24_4_ = fVar145;
          iVar1 = (uint)(byte)(uVar59 >> 7) * auVar100._28_4_;
          auVar113._28_4_ = iVar1;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar19),auVar82);
          auVar114._0_4_ =
               (uint)(bVar58 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar75._0_4_;
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar114._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * auVar75._4_4_;
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar114._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * auVar75._8_4_;
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar114._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * auVar75._12_4_;
          auVar114._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * auVar94._16_4_;
          auVar114._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * auVar94._20_4_;
          auVar114._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * auVar94._24_4_;
          auVar114._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar76));
          auVar115._0_4_ =
               (float)((uint)(bVar58 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar77._0_4_);
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * auVar77._4_4_);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * auVar77._8_4_);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * auVar77._12_4_);
          fVar122 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar94._16_4_);
          auVar115._16_4_ = fVar122;
          fVar70 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar94._20_4_);
          auVar115._20_4_ = fVar70;
          fVar69 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar94._24_4_);
          auVar115._24_4_ = fVar69;
          auVar115._28_4_ = (uint)(byte)(uVar59 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar74));
          auVar116._0_4_ =
               (float)((uint)(bVar58 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar58 & 1) * auVar17._0_4_);
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * auVar17._4_4_);
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * auVar17._8_4_);
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * auVar17._12_4_);
          fVar127 = (float)((uint)((byte)(uVar59 >> 4) & 1) * auVar94._16_4_);
          auVar116._16_4_ = fVar127;
          fVar123 = (float)((uint)((byte)(uVar59 >> 5) & 1) * auVar94._20_4_);
          auVar116._20_4_ = fVar123;
          fVar126 = (float)((uint)((byte)(uVar59 >> 6) & 1) * auVar94._24_4_);
          auVar116._24_4_ = fVar126;
          iVar2 = (uint)(byte)(uVar59 >> 7) * auVar94._28_4_;
          auVar116._28_4_ = iVar2;
          auVar117._0_4_ =
               (uint)(bVar58 & 1) * (int)auVar19._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar82._0_4_;
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar10 * (int)auVar19._4_4_ | (uint)!bVar10 * auVar82._4_4_;
          bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar10 * (int)auVar19._8_4_ | (uint)!bVar10 * auVar82._8_4_;
          bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar10 * (int)auVar19._12_4_ | (uint)!bVar10 * auVar82._12_4_;
          auVar117._16_4_ = (uint)!(bool)((byte)(uVar59 >> 4) & 1) * auVar82._16_4_;
          auVar117._20_4_ = (uint)!(bool)((byte)(uVar59 >> 5) & 1) * auVar82._20_4_;
          auVar117._24_4_ = (uint)!(bool)((byte)(uVar59 >> 6) & 1) * auVar82._24_4_;
          auVar117._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar82._28_4_;
          bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar59 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar59 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar59 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar59 >> 3) & 1);
          auVar82 = vsubps_avx512vl(auVar117,auVar99);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar78._12_4_ |
                                                  (uint)!bVar14 * auVar76._12_4_,
                                                  CONCAT48((uint)bVar12 * (int)auVar78._8_4_ |
                                                           (uint)!bVar12 * auVar76._8_4_,
                                                           CONCAT44((uint)bVar10 *
                                                                    (int)auVar78._4_4_ |
                                                                    (uint)!bVar10 * auVar76._4_4_,
                                                                    (uint)(bVar58 & 1) *
                                                                    (int)auVar78._0_4_ |
                                                                    (uint)!(bool)(bVar58 & 1) *
                                                                    auVar76._0_4_)))),auVar95);
          auVar184 = ZEXT3264(auVar96);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar73._12_4_ |
                                                   (uint)!bVar15 * auVar74._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar73._8_4_ |
                                                            (uint)!bVar13 * auVar74._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar73._4_4_ |
                                                                     (uint)!bVar11 * auVar74._4_4_,
                                                                     (uint)(bVar58 & 1) *
                                                                     (int)auVar73._0_4_ |
                                                                     (uint)!(bool)(bVar58 & 1) *
                                                                     auVar74._0_4_)))),auVar113);
          auVar98 = vsubps_avx(auVar99,auVar114);
          auVar191 = ZEXT3264(auVar98);
          auVar97 = vsubps_avx(auVar95,auVar115);
          auVar81 = vsubps_avx(auVar113,auVar116);
          auVar47._4_4_ = auVar100._4_4_ * fVar124;
          auVar47._0_4_ = auVar100._0_4_ * fVar130;
          auVar47._8_4_ = auVar100._8_4_ * fVar128;
          auVar47._12_4_ = auVar100._12_4_ * fVar132;
          auVar47._16_4_ = auVar100._16_4_ * 0.0;
          auVar47._20_4_ = auVar100._20_4_ * 0.0;
          auVar47._24_4_ = auVar100._24_4_ * 0.0;
          auVar47._28_4_ = 0;
          auVar76 = vfmsub231ps_fma(auVar47,auVar113,auVar82);
          auVar171._0_4_ = fVar131 * auVar82._0_4_;
          auVar171._4_4_ = fVar125 * auVar82._4_4_;
          auVar171._8_4_ = fVar129 * auVar82._8_4_;
          auVar171._12_4_ = fVar133 * auVar82._12_4_;
          auVar171._16_4_ = auVar82._16_4_ * 0.0;
          auVar171._20_4_ = auVar82._20_4_ * 0.0;
          auVar171._24_4_ = auVar82._24_4_ * 0.0;
          auVar171._28_4_ = 0;
          auVar74 = vfmsub231ps_fma(auVar171,auVar99,auVar96);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar87,ZEXT1632(auVar76));
          auVar176._0_4_ = auVar96._0_4_ * auVar113._0_4_;
          auVar176._4_4_ = auVar96._4_4_ * auVar113._4_4_;
          auVar176._8_4_ = auVar96._8_4_ * auVar113._8_4_;
          auVar176._12_4_ = auVar96._12_4_ * auVar113._12_4_;
          auVar176._16_4_ = auVar96._16_4_ * fVar144;
          auVar176._20_4_ = auVar96._20_4_ * fVar163;
          auVar176._24_4_ = auVar96._24_4_ * fVar145;
          auVar176._28_4_ = 0;
          auVar76 = vfmsub231ps_fma(auVar176,auVar95,auVar100);
          auVar83 = vfmadd231ps_avx512vl(auVar94,auVar87,ZEXT1632(auVar76));
          auVar94 = vmulps_avx512vl(auVar81,auVar114);
          auVar94 = vfmsub231ps_avx512vl(auVar94,auVar98,auVar116);
          auVar48._4_4_ = auVar97._4_4_ * auVar116._4_4_;
          auVar48._0_4_ = auVar97._0_4_ * auVar116._0_4_;
          auVar48._8_4_ = auVar97._8_4_ * auVar116._8_4_;
          auVar48._12_4_ = auVar97._12_4_ * auVar116._12_4_;
          auVar48._16_4_ = auVar97._16_4_ * fVar127;
          auVar48._20_4_ = auVar97._20_4_ * fVar123;
          auVar48._24_4_ = auVar97._24_4_ * fVar126;
          auVar48._28_4_ = iVar2;
          auVar76 = vfmsub231ps_fma(auVar48,auVar115,auVar81);
          auVar177._0_4_ = auVar115._0_4_ * auVar98._0_4_;
          auVar177._4_4_ = auVar115._4_4_ * auVar98._4_4_;
          auVar177._8_4_ = auVar115._8_4_ * auVar98._8_4_;
          auVar177._12_4_ = auVar115._12_4_ * auVar98._12_4_;
          auVar177._16_4_ = fVar122 * auVar98._16_4_;
          auVar177._20_4_ = fVar70 * auVar98._20_4_;
          auVar177._24_4_ = fVar69 * auVar98._24_4_;
          auVar177._28_4_ = 0;
          auVar74 = vfmsub231ps_fma(auVar177,auVar97,auVar114);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar87,auVar94);
          auVar86 = vfmadd231ps_avx512vl(auVar94,auVar87,ZEXT1632(auVar76));
          auVar178 = ZEXT3264(auVar86);
          auVar94 = vmaxps_avx(auVar83,auVar86);
          uVar20 = vcmpps_avx512vl(auVar94,auVar87,2);
          bVar68 = bVar68 & (byte)uVar20;
          if (bVar68 != 0) {
            auVar49._4_4_ = auVar81._4_4_ * auVar96._4_4_;
            auVar49._0_4_ = auVar81._0_4_ * auVar96._0_4_;
            auVar49._8_4_ = auVar81._8_4_ * auVar96._8_4_;
            auVar49._12_4_ = auVar81._12_4_ * auVar96._12_4_;
            auVar49._16_4_ = auVar81._16_4_ * auVar96._16_4_;
            auVar49._20_4_ = auVar81._20_4_ * auVar96._20_4_;
            auVar49._24_4_ = auVar81._24_4_ * auVar96._24_4_;
            auVar49._28_4_ = auVar94._28_4_;
            auVar16 = vfmsub231ps_fma(auVar49,auVar97,auVar100);
            auVar50._4_4_ = auVar100._4_4_ * auVar98._4_4_;
            auVar50._0_4_ = auVar100._0_4_ * auVar98._0_4_;
            auVar50._8_4_ = auVar100._8_4_ * auVar98._8_4_;
            auVar50._12_4_ = auVar100._12_4_ * auVar98._12_4_;
            auVar50._16_4_ = auVar100._16_4_ * auVar98._16_4_;
            auVar50._20_4_ = auVar100._20_4_ * auVar98._20_4_;
            auVar50._24_4_ = auVar100._24_4_ * auVar98._24_4_;
            auVar50._28_4_ = auVar100._28_4_;
            auVar75 = vfmsub231ps_fma(auVar50,auVar82,auVar81);
            auVar51._4_4_ = auVar97._4_4_ * auVar82._4_4_;
            auVar51._0_4_ = auVar97._0_4_ * auVar82._0_4_;
            auVar51._8_4_ = auVar97._8_4_ * auVar82._8_4_;
            auVar51._12_4_ = auVar97._12_4_ * auVar82._12_4_;
            auVar51._16_4_ = auVar97._16_4_ * auVar82._16_4_;
            auVar51._20_4_ = auVar97._20_4_ * auVar82._20_4_;
            auVar51._24_4_ = auVar97._24_4_ * auVar82._24_4_;
            auVar51._28_4_ = auVar97._28_4_;
            auVar77 = vfmsub231ps_fma(auVar51,auVar98,auVar96);
            auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar75),ZEXT1632(auVar77));
            auVar74 = vfmadd231ps_fma(ZEXT1632(auVar76),ZEXT1632(auVar16),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar94 = vrcp14ps_avx512vl(ZEXT1632(auVar74));
            auVar191 = ZEXT3264(auVar94);
            auVar27._8_4_ = 0x3f800000;
            auVar27._0_8_ = 0x3f8000003f800000;
            auVar27._12_4_ = 0x3f800000;
            auVar27._16_4_ = 0x3f800000;
            auVar27._20_4_ = 0x3f800000;
            auVar27._24_4_ = 0x3f800000;
            auVar27._28_4_ = 0x3f800000;
            auVar96 = vfnmadd213ps_avx512vl(auVar94,ZEXT1632(auVar74),auVar27);
            auVar76 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
            auVar184 = ZEXT1664(auVar76);
            auVar52._4_4_ = auVar77._4_4_ * auVar113._4_4_;
            auVar52._0_4_ = auVar77._0_4_ * auVar113._0_4_;
            auVar52._8_4_ = auVar77._8_4_ * auVar113._8_4_;
            auVar52._12_4_ = auVar77._12_4_ * auVar113._12_4_;
            auVar52._16_4_ = fVar144 * 0.0;
            auVar52._20_4_ = fVar163 * 0.0;
            auVar52._24_4_ = fVar145 * 0.0;
            auVar52._28_4_ = iVar1;
            auVar75 = vfmadd231ps_fma(auVar52,auVar95,ZEXT1632(auVar75));
            auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar99,ZEXT1632(auVar16));
            fVar144 = auVar76._0_4_;
            fVar145 = auVar76._4_4_;
            fVar69 = auVar76._8_4_;
            fVar70 = auVar76._12_4_;
            local_280 = ZEXT1632(CONCAT412(auVar75._12_4_ * fVar70,
                                           CONCAT48(auVar75._8_4_ * fVar69,
                                                    CONCAT44(auVar75._4_4_ * fVar145,
                                                             auVar75._0_4_ * fVar144))));
            auVar198 = ZEXT3264(local_280);
            uVar20 = vcmpps_avx512vl(local_280,local_3e0,0xd);
            fVar163 = (ray->super_RayK<1>).tfar;
            auVar28._4_4_ = fVar163;
            auVar28._0_4_ = fVar163;
            auVar28._8_4_ = fVar163;
            auVar28._12_4_ = fVar163;
            auVar28._16_4_ = fVar163;
            auVar28._20_4_ = fVar163;
            auVar28._24_4_ = fVar163;
            auVar28._28_4_ = fVar163;
            uVar22 = vcmpps_avx512vl(local_280,auVar28,2);
            bVar68 = (byte)uVar20 & (byte)uVar22 & bVar68;
            if (bVar68 != 0) {
              uVar63 = vcmpps_avx512vl(ZEXT1632(auVar74),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar63 = bVar68 & uVar63;
              if ((char)uVar63 != '\0') {
                fVar163 = auVar83._0_4_ * fVar144;
                fVar122 = auVar83._4_4_ * fVar145;
                auVar53._4_4_ = fVar122;
                auVar53._0_4_ = fVar163;
                fVar123 = auVar83._8_4_ * fVar69;
                auVar53._8_4_ = fVar123;
                fVar126 = auVar83._12_4_ * fVar70;
                auVar53._12_4_ = fVar126;
                fVar127 = auVar83._16_4_ * 0.0;
                auVar53._16_4_ = fVar127;
                fVar130 = auVar83._20_4_ * 0.0;
                auVar53._20_4_ = fVar130;
                fVar131 = auVar83._24_4_ * 0.0;
                auVar53._24_4_ = fVar131;
                auVar53._28_4_ = auVar83._28_4_;
                auVar162._8_4_ = 0x3f800000;
                auVar162._0_8_ = 0x3f8000003f800000;
                auVar162._12_4_ = 0x3f800000;
                auVar162._16_4_ = 0x3f800000;
                auVar162._20_4_ = 0x3f800000;
                auVar162._24_4_ = 0x3f800000;
                auVar162._28_4_ = 0x3f800000;
                auVar94 = vsubps_avx(auVar162,auVar53);
                local_2c0._0_4_ =
                     (float)((uint)(bVar58 & 1) * (int)fVar163 |
                            (uint)!(bool)(bVar58 & 1) * auVar94._0_4_);
                bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar10 * (int)fVar122 | (uint)!bVar10 * auVar94._4_4_);
                bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar10 * (int)fVar123 | (uint)!bVar10 * auVar94._8_4_);
                bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar10 * (int)fVar126 | (uint)!bVar10 * auVar94._12_4_);
                bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar10 * (int)fVar127 | (uint)!bVar10 * auVar94._16_4_);
                bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar10 * (int)fVar130 | (uint)!bVar10 * auVar94._20_4_);
                bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar10 * (int)fVar131 | (uint)!bVar10 * auVar94._24_4_);
                bVar10 = SUB81(uVar59 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar10 * auVar83._28_4_ | (uint)!bVar10 * auVar94._28_4_);
                auVar94 = vsubps_avx(auVar85,auVar84);
                auVar76 = vfmadd213ps_fma(auVar94,local_2c0,auVar84);
                fVar163 = pre->depth_scale;
                auVar29._4_4_ = fVar163;
                auVar29._0_4_ = fVar163;
                auVar29._8_4_ = fVar163;
                auVar29._12_4_ = fVar163;
                auVar29._16_4_ = fVar163;
                auVar29._20_4_ = fVar163;
                auVar29._24_4_ = fVar163;
                auVar29._28_4_ = fVar163;
                auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                             CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                                                      CONCAT44(auVar76._4_4_ +
                                                                               auVar76._4_4_,
                                                                               auVar76._0_4_ +
                                                                               auVar76._0_4_)))),
                                          auVar29);
                uVar21 = vcmpps_avx512vl(local_280,auVar94,6);
                uVar63 = uVar63 & uVar21;
                bVar68 = (byte)uVar63;
                if (bVar68 != 0) {
                  auVar149._0_4_ = auVar86._0_4_ * fVar144;
                  auVar149._4_4_ = auVar86._4_4_ * fVar145;
                  auVar149._8_4_ = auVar86._8_4_ * fVar69;
                  auVar149._12_4_ = auVar86._12_4_ * fVar70;
                  auVar149._16_4_ = auVar86._16_4_ * 0.0;
                  auVar149._20_4_ = auVar86._20_4_ * 0.0;
                  auVar149._24_4_ = auVar86._24_4_ * 0.0;
                  auVar149._28_4_ = 0;
                  auVar172._8_4_ = 0x3f800000;
                  auVar172._0_8_ = 0x3f8000003f800000;
                  auVar172._12_4_ = 0x3f800000;
                  auVar172._16_4_ = 0x3f800000;
                  auVar172._20_4_ = 0x3f800000;
                  auVar172._24_4_ = 0x3f800000;
                  auVar172._28_4_ = 0x3f800000;
                  auVar94 = vsubps_avx(auVar172,auVar149);
                  auVar118._0_4_ =
                       (uint)(bVar58 & 1) * (int)auVar149._0_4_ |
                       (uint)!(bool)(bVar58 & 1) * auVar94._0_4_;
                  bVar10 = (bool)((byte)(uVar59 >> 1) & 1);
                  auVar118._4_4_ =
                       (uint)bVar10 * (int)auVar149._4_4_ | (uint)!bVar10 * auVar94._4_4_;
                  bVar10 = (bool)((byte)(uVar59 >> 2) & 1);
                  auVar118._8_4_ =
                       (uint)bVar10 * (int)auVar149._8_4_ | (uint)!bVar10 * auVar94._8_4_;
                  bVar10 = (bool)((byte)(uVar59 >> 3) & 1);
                  auVar118._12_4_ =
                       (uint)bVar10 * (int)auVar149._12_4_ | (uint)!bVar10 * auVar94._12_4_;
                  bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
                  auVar118._16_4_ =
                       (uint)bVar10 * (int)auVar149._16_4_ | (uint)!bVar10 * auVar94._16_4_;
                  bVar10 = (bool)((byte)(uVar59 >> 5) & 1);
                  auVar118._20_4_ =
                       (uint)bVar10 * (int)auVar149._20_4_ | (uint)!bVar10 * auVar94._20_4_;
                  bVar10 = (bool)((byte)(uVar59 >> 6) & 1);
                  auVar118._24_4_ =
                       (uint)bVar10 * (int)auVar149._24_4_ | (uint)!bVar10 * auVar94._24_4_;
                  auVar118._28_4_ = (uint)!SUB81(uVar59 >> 7,0) * auVar94._28_4_;
                  auVar30._8_4_ = 0x40000000;
                  auVar30._0_8_ = 0x4000000040000000;
                  auVar30._12_4_ = 0x40000000;
                  auVar30._16_4_ = 0x40000000;
                  auVar30._20_4_ = 0x40000000;
                  auVar30._24_4_ = 0x40000000;
                  auVar30._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar118,auVar172,auVar30);
                  local_260 = (int)lVar66;
                  local_25c = iVar8;
                  auVar191 = ZEXT1664(local_4b0);
                  local_250 = local_4b0;
                  auVar193 = ZEXT1664(local_4c0);
                  local_240 = local_4c0;
                  local_230 = local_520;
                  uStack_228 = uStack_518;
                  local_220 = CONCAT44(fStack_52c,local_530);
                  uStack_218 = CONCAT44(fStack_524,fStack_528);
                  pGVar65 = (context->scene->geometries).items[local_550].ptr;
                  if ((pGVar65->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar76 = vcvtsi2ss_avx512f(auVar80,(int)lVar66);
                    fVar163 = auVar76._0_4_;
                    local_200[0] = (fVar163 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar163 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar163 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar163 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar163 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar163 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar163 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar163 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar141._8_4_ = 0x7f800000;
                    auVar141._0_8_ = 0x7f8000007f800000;
                    auVar141._12_4_ = 0x7f800000;
                    auVar141._16_4_ = 0x7f800000;
                    auVar141._20_4_ = 0x7f800000;
                    auVar141._24_4_ = 0x7f800000;
                    auVar141._28_4_ = 0x7f800000;
                    auVar94 = vblendmps_avx512vl(auVar141,local_280);
                    auVar119._0_4_ =
                         (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * 0x7f800000
                    ;
                    bVar10 = (bool)((byte)(uVar63 >> 1) & 1);
                    auVar119._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
                    auVar119._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar63 >> 3) & 1);
                    auVar119._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar63 >> 4) & 1);
                    auVar119._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
                    auVar119._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
                    auVar119._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * 0x7f800000;
                    bVar10 = SUB81(uVar63 >> 7,0);
                    auVar119._28_4_ = (uint)bVar10 * auVar94._28_4_ | (uint)!bVar10 * 0x7f800000;
                    auVar94 = vshufps_avx(auVar119,auVar119,0xb1);
                    auVar94 = vminps_avx(auVar119,auVar94);
                    auVar96 = vshufpd_avx(auVar94,auVar94,5);
                    auVar94 = vminps_avx(auVar94,auVar96);
                    auVar96 = vpermpd_avx2(auVar94,0x4e);
                    auVar94 = vminps_avx(auVar94,auVar96);
                    uVar20 = vcmpps_avx512vl(auVar119,auVar94,0);
                    uVar61 = (uint)uVar63;
                    if ((bVar68 & (byte)uVar20) != 0) {
                      uVar61 = (uint)(bVar68 & (byte)uVar20);
                    }
                    uVar62 = 0;
                    for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
                      uVar62 = uVar62 + 1;
                    }
                    uVar59 = (ulong)uVar62;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar65->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_440 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_460 = local_280;
                      local_468 = pGVar65;
                      do {
                        local_494 = local_200[uVar59];
                        local_490 = *(undefined4 *)(local_1e0 + uVar59 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar59 * 4);
                        local_4f0.context = context->user;
                        fVar144 = 1.0 - local_494;
                        fVar163 = fVar144 * fVar144 * -3.0;
                        auVar178 = ZEXT464((uint)fVar163);
                        auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144)),
                                                  ZEXT416((uint)(local_494 * fVar144)),
                                                  ZEXT416(0xc0000000));
                        auVar74 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar144)),
                                                  ZEXT416((uint)(local_494 * local_494)),
                                                  ZEXT416(0x40000000));
                        fVar144 = auVar76._0_4_ * 3.0;
                        fVar145 = auVar74._0_4_ * 3.0;
                        fVar69 = local_494 * local_494 * 3.0;
                        auVar182._0_4_ = fVar69 * local_530;
                        auVar182._4_4_ = fVar69 * fStack_52c;
                        auVar182._8_4_ = fVar69 * fStack_528;
                        auVar182._12_4_ = fVar69 * fStack_524;
                        auVar184 = ZEXT1664(auVar182);
                        auVar157._4_4_ = fVar145;
                        auVar157._0_4_ = fVar145;
                        auVar157._8_4_ = fVar145;
                        auVar157._12_4_ = fVar145;
                        auVar56._8_8_ = uStack_518;
                        auVar56._0_8_ = local_520;
                        auVar76 = vfmadd132ps_fma(auVar157,auVar182,auVar56);
                        auVar168._4_4_ = fVar144;
                        auVar168._0_4_ = fVar144;
                        auVar168._8_4_ = fVar144;
                        auVar168._12_4_ = fVar144;
                        auVar76 = vfmadd213ps_fma(auVar168,auVar193._0_16_,auVar76);
                        auVar158._4_4_ = fVar163;
                        auVar158._0_4_ = fVar163;
                        auVar158._8_4_ = fVar163;
                        auVar158._12_4_ = fVar163;
                        auVar76 = vfmadd213ps_fma(auVar158,auVar191._0_16_,auVar76);
                        local_4a0 = vmovlps_avx(auVar76);
                        local_498 = vextractps_avx(auVar76,2);
                        local_48c = (int)local_538;
                        local_488 = (int)local_550;
                        local_484 = (local_4f0.context)->instID[0];
                        local_480 = (local_4f0.context)->instPrimID[0];
                        local_554 = -1;
                        local_4f0.valid = &local_554;
                        local_4f0.geometryUserPtr = pGVar65->userPtr;
                        local_4f0.ray = (RTCRayN *)ray;
                        local_4f0.hit = (RTCHitN *)&local_4a0;
                        local_4f0.N = 1;
                        if (pGVar65->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01834f2b:
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar178 = ZEXT1664(auVar178._0_16_);
                            auVar184 = ZEXT1664(auVar184._0_16_);
                            (*p_Var9)(&local_4f0);
                            auVar198 = ZEXT3264(local_460);
                            auVar193 = ZEXT1664(local_4c0);
                            auVar191 = ZEXT1664(local_4b0);
                            context = local_548;
                            ray = local_540;
                            pGVar65 = local_468;
                            if (*local_4f0.valid == 0) goto LAB_01834fe6;
                          }
                          (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).components[0] =
                               *(float *)local_4f0.hit;
                          (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4f0.hit + 4);
                          (((Vec3f *)((long)local_4f0.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4f0.hit + 8);
                          *(float *)((long)local_4f0.ray + 0x3c) = *(float *)(local_4f0.hit + 0xc);
                          *(float *)((long)local_4f0.ray + 0x40) = *(float *)(local_4f0.hit + 0x10);
                          *(float *)((long)local_4f0.ray + 0x44) = *(float *)(local_4f0.hit + 0x14);
                          *(float *)((long)local_4f0.ray + 0x48) = *(float *)(local_4f0.hit + 0x18);
                          *(float *)((long)local_4f0.ray + 0x4c) = *(float *)(local_4f0.hit + 0x1c);
                          *(float *)((long)local_4f0.ray + 0x50) = *(float *)(local_4f0.hit + 0x20);
                        }
                        else {
                          auVar178 = ZEXT464((uint)fVar163);
                          auVar184 = ZEXT1664(auVar182);
                          (*pGVar65->intersectionFilterN)(&local_4f0);
                          auVar198 = ZEXT3264(local_460);
                          auVar193 = ZEXT1664(local_4c0);
                          auVar191 = ZEXT1664(local_4b0);
                          context = local_548;
                          ray = local_540;
                          pGVar65 = local_468;
                          if (*local_4f0.valid != 0) goto LAB_01834f2b;
LAB_01834fe6:
                          (local_540->super_RayK<1>).tfar = (float)local_440._0_4_;
                          context = local_548;
                          ray = local_540;
                          pGVar65 = local_468;
                        }
                        bVar68 = ~(byte)(1 << ((uint)uVar59 & 0x1f)) & (byte)uVar63;
                        fVar163 = (ray->super_RayK<1>).tfar;
                        auVar31._4_4_ = fVar163;
                        auVar31._0_4_ = fVar163;
                        auVar31._8_4_ = fVar163;
                        auVar31._12_4_ = fVar163;
                        auVar31._16_4_ = fVar163;
                        auVar31._20_4_ = fVar163;
                        auVar31._24_4_ = fVar163;
                        auVar31._28_4_ = fVar163;
                        uVar20 = vcmpps_avx512vl(auVar198._0_32_,auVar31,2);
                        pre = local_508;
                        prim = local_500;
                        if ((bVar68 & (byte)uVar20) == 0) goto LAB_01834d7e;
                        local_440 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar68 = bVar68 & (byte)uVar20;
                        uVar63 = (ulong)bVar68;
                        auVar142._8_4_ = 0x7f800000;
                        auVar142._0_8_ = 0x7f8000007f800000;
                        auVar142._12_4_ = 0x7f800000;
                        auVar142._16_4_ = 0x7f800000;
                        auVar142._20_4_ = 0x7f800000;
                        auVar142._24_4_ = 0x7f800000;
                        auVar142._28_4_ = 0x7f800000;
                        auVar94 = vblendmps_avx512vl(auVar142,auVar198._0_32_);
                        auVar120._0_4_ =
                             (uint)(bVar68 & 1) * auVar94._0_4_ |
                             (uint)!(bool)(bVar68 & 1) * 0x7f800000;
                        bVar10 = (bool)(bVar68 >> 1 & 1);
                        auVar120._4_4_ = (uint)bVar10 * auVar94._4_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar68 >> 2 & 1);
                        auVar120._8_4_ = (uint)bVar10 * auVar94._8_4_ | (uint)!bVar10 * 0x7f800000;
                        bVar10 = (bool)(bVar68 >> 3 & 1);
                        auVar120._12_4_ = (uint)bVar10 * auVar94._12_4_ | (uint)!bVar10 * 0x7f800000
                        ;
                        bVar10 = (bool)(bVar68 >> 4 & 1);
                        auVar120._16_4_ = (uint)bVar10 * auVar94._16_4_ | (uint)!bVar10 * 0x7f800000
                        ;
                        bVar10 = (bool)(bVar68 >> 5 & 1);
                        auVar120._20_4_ = (uint)bVar10 * auVar94._20_4_ | (uint)!bVar10 * 0x7f800000
                        ;
                        bVar10 = (bool)(bVar68 >> 6 & 1);
                        auVar120._24_4_ = (uint)bVar10 * auVar94._24_4_ | (uint)!bVar10 * 0x7f800000
                        ;
                        auVar120._28_4_ =
                             (uint)(bVar68 >> 7) * auVar94._28_4_ |
                             (uint)!(bool)(bVar68 >> 7) * 0x7f800000;
                        auVar94 = vshufps_avx(auVar120,auVar120,0xb1);
                        auVar94 = vminps_avx(auVar120,auVar94);
                        auVar96 = vshufpd_avx(auVar94,auVar94,5);
                        auVar94 = vminps_avx(auVar94,auVar96);
                        auVar96 = vpermpd_avx2(auVar94,0x4e);
                        auVar94 = vminps_avx(auVar94,auVar96);
                        uVar20 = vcmpps_avx512vl(auVar120,auVar94,0);
                        bVar58 = (byte)uVar20 & bVar68;
                        if (bVar58 != 0) {
                          bVar68 = bVar58;
                        }
                        uVar61 = 0;
                        for (uVar62 = (uint)bVar68; (uVar62 & 1) == 0;
                            uVar62 = uVar62 >> 1 | 0x80000000) {
                          uVar61 = uVar61 + 1;
                        }
                        uVar59 = (ulong)uVar61;
                      } while( true );
                    }
                    fVar163 = local_200[uVar59];
                    fVar144 = *(float *)(local_1e0 + uVar59 * 4);
                    fVar69 = 1.0 - fVar163;
                    fVar145 = fVar69 * fVar69 * -3.0;
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar69 * fVar69)),
                                              ZEXT416((uint)(fVar163 * fVar69)),ZEXT416(0xc0000000))
                    ;
                    auVar74 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar69)),
                                              ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000)
                                             );
                    fVar69 = auVar76._0_4_ * 3.0;
                    fVar70 = auVar74._0_4_ * 3.0;
                    fVar122 = fVar163 * fVar163 * 3.0;
                    auVar181._0_4_ = fVar122 * local_530;
                    auVar181._4_4_ = fVar122 * fStack_52c;
                    auVar181._8_4_ = fVar122 * fStack_528;
                    auVar181._12_4_ = fVar122 * fStack_524;
                    auVar184 = ZEXT1664(auVar181);
                    auVar155._4_4_ = fVar70;
                    auVar155._0_4_ = fVar70;
                    auVar155._8_4_ = fVar70;
                    auVar155._12_4_ = fVar70;
                    auVar55._8_8_ = uStack_518;
                    auVar55._0_8_ = local_520;
                    auVar76 = vfmadd132ps_fma(auVar155,auVar181,auVar55);
                    auVar167._4_4_ = fVar69;
                    auVar167._0_4_ = fVar69;
                    auVar167._8_4_ = fVar69;
                    auVar167._12_4_ = fVar69;
                    auVar76 = vfmadd213ps_fma(auVar167,local_4c0,auVar76);
                    auVar156._4_4_ = fVar145;
                    auVar156._0_4_ = fVar145;
                    auVar156._8_4_ = fVar145;
                    auVar156._12_4_ = fVar145;
                    auVar178 = ZEXT464((uint)*(float *)(local_1c0 + uVar59 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar59 * 4);
                    auVar76 = vfmadd213ps_fma(auVar156,local_4b0,auVar76);
                    uVar20 = vmovlps_avx(auVar76);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                    fVar145 = (float)vextractps_avx(auVar76,2);
                    (ray->Ng).field_0.field_0.z = fVar145;
                    ray->u = fVar163;
                    ray->v = fVar144;
                    ray->primID = (uint)local_538;
                    ray->geomID = (uint)local_550;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
LAB_01834d7e:
      }
    }
    fVar163 = (ray->super_RayK<1>).tfar;
    auVar24._4_4_ = fVar163;
    auVar24._0_4_ = fVar163;
    auVar24._8_4_ = fVar163;
    auVar24._12_4_ = fVar163;
    uVar20 = vcmpps_avx512vl(local_190,auVar24,2);
    uVar67 = (ulong)((uint)uVar67 & (uint)uVar20);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }